

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_util.h
# Opt level: O3

void google::protobuf::TestUtil::ExpectExtensionsClear<proto2_unittest::TestAllExtensions>
               (TestAllExtensions *message)

{
  bool bVar1;
  int32_t iVar2;
  uint32_t uVar3;
  uint uVar4;
  int iVar5;
  string *psVar6;
  MessageLite *pMVar7;
  anon_union_32_1_493b367e_for_TestAllExtensions_3 *this;
  char *in_R9;
  char *pcVar8;
  float fVar9;
  string serialized;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_90;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_80;
  AssertHelper local_78;
  undefined1 local_70 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  string local_50;
  
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  local_50._M_string_length = 0;
  local_50.field_2._M_local_buf[0] = '\0';
  bVar1 = MessageLite::SerializeToString((MessageLite *)message,&local_50);
  local_88._M_head_impl._0_1_ = (internal)bVar1;
  local_80 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (bVar1) {
    pcVar8 = anon_var_dwarf_a22956 + 5;
    testing::internal::CmpHelperEQ<char[1],std::__cxx11::string>
              ((internal *)local_70,"\"\"","serialized",(char (*) [1])(anon_var_dwarf_a22956 + 5),
               &local_50);
    if (local_70[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_88);
      if (local_68 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar8 = (local_68->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_90,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                 ,0xc58,pcVar8);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_90,(Message *)&local_88);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_90);
      if (local_88._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_88._M_head_impl + 8))();
      }
    }
    if (local_68 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_68,local_68);
    }
    local_90._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
         ((ulong)local_90._M_head_impl._4_4_ << 0x20);
    local_88._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
         proto2_unittest::TestAllExtensions::ByteSizeLong(message);
    testing::internal::CmpHelperEQ<int,unsigned_long>
              ((internal *)local_70,"0","message.ByteSizeLong()",(int *)&local_90,
               (unsigned_long *)&local_88);
    if (local_70[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_88);
      if (local_68 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar8 = anon_var_dwarf_a22956 + 5;
      }
      else {
        pcVar8 = (local_68->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_90,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                 ,0xc59,pcVar8);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_90,(Message *)&local_88);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_90);
      if (local_88._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_88._M_head_impl + 8))();
      }
    }
    if (local_68 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_68,local_68);
    }
    this = &message->field_0;
    bVar1 = protobuf::internal::ExtensionSet::Has
                      (&(this->_impl_)._extensions_,proto2_unittest::optional_int32_extension);
    local_80 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_88._M_head_impl._0_1_ = (internal)!bVar1;
    if (bVar1) {
      testing::Message::Message((Message *)&local_90);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_70,(internal *)&local_88,
                 (AssertionResult *)"message.HasExtension(Traits::optional_int32_extension)","true",
                 "false",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_78,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                 ,0xc5c,(char *)CONCAT71(local_70._1_7_,local_70[0]));
      testing::internal::AssertHelper::operator=(&local_78,(Message *)&local_90);
      testing::internal::AssertHelper::~AssertHelper(&local_78);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_70._1_7_,local_70[0]) != &local_60) {
        operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT71(local_70._1_7_,local_70[0]),local_60._M_allocated_capacity + 1);
      }
      if (local_90._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_90._M_head_impl + 8))();
      }
      if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_80,local_80);
      }
    }
    bVar1 = protobuf::internal::ExtensionSet::Has
                      (&(this->_impl_)._extensions_,proto2_unittest::optional_int64_extension);
    local_88._M_head_impl._0_1_ = (internal)!bVar1;
    local_80 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (bVar1) {
      testing::Message::Message((Message *)&local_90);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_70,(internal *)&local_88,
                 (AssertionResult *)"message.HasExtension(Traits::optional_int64_extension)","true",
                 "false",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_78,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                 ,0xc5d,(char *)CONCAT71(local_70._1_7_,local_70[0]));
      testing::internal::AssertHelper::operator=(&local_78,(Message *)&local_90);
      testing::internal::AssertHelper::~AssertHelper(&local_78);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_70._1_7_,local_70[0]) != &local_60) {
        operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT71(local_70._1_7_,local_70[0]),local_60._M_allocated_capacity + 1);
      }
      if (local_90._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_90._M_head_impl + 8))();
      }
      if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_80,local_80);
      }
    }
    bVar1 = protobuf::internal::ExtensionSet::Has
                      (&(this->_impl_)._extensions_,proto2_unittest::optional_uint32_extension);
    local_88._M_head_impl._0_1_ = (internal)!bVar1;
    local_80 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (bVar1) {
      testing::Message::Message((Message *)&local_90);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_70,(internal *)&local_88,
                 (AssertionResult *)"message.HasExtension(Traits::optional_uint32_extension)","true"
                 ,"false",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_78,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                 ,0xc5e,(char *)CONCAT71(local_70._1_7_,local_70[0]));
      testing::internal::AssertHelper::operator=(&local_78,(Message *)&local_90);
      testing::internal::AssertHelper::~AssertHelper(&local_78);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_70._1_7_,local_70[0]) != &local_60) {
        operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT71(local_70._1_7_,local_70[0]),local_60._M_allocated_capacity + 1);
      }
      if (local_90._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_90._M_head_impl + 8))();
      }
      if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_80,local_80);
      }
    }
    bVar1 = protobuf::internal::ExtensionSet::Has
                      (&(this->_impl_)._extensions_,proto2_unittest::optional_uint64_extension);
    local_88._M_head_impl._0_1_ = (internal)!bVar1;
    local_80 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (bVar1) {
      testing::Message::Message((Message *)&local_90);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_70,(internal *)&local_88,
                 (AssertionResult *)"message.HasExtension(Traits::optional_uint64_extension)","true"
                 ,"false",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_78,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                 ,0xc5f,(char *)CONCAT71(local_70._1_7_,local_70[0]));
      testing::internal::AssertHelper::operator=(&local_78,(Message *)&local_90);
      testing::internal::AssertHelper::~AssertHelper(&local_78);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_70._1_7_,local_70[0]) != &local_60) {
        operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT71(local_70._1_7_,local_70[0]),local_60._M_allocated_capacity + 1);
      }
      if (local_90._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_90._M_head_impl + 8))();
      }
      if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_80,local_80);
      }
    }
    bVar1 = protobuf::internal::ExtensionSet::Has
                      (&(this->_impl_)._extensions_,proto2_unittest::optional_sint32_extension);
    local_88._M_head_impl._0_1_ = (internal)!bVar1;
    local_80 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (bVar1) {
      testing::Message::Message((Message *)&local_90);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_70,(internal *)&local_88,
                 (AssertionResult *)"message.HasExtension(Traits::optional_sint32_extension)","true"
                 ,"false",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_78,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                 ,0xc60,(char *)CONCAT71(local_70._1_7_,local_70[0]));
      testing::internal::AssertHelper::operator=(&local_78,(Message *)&local_90);
      testing::internal::AssertHelper::~AssertHelper(&local_78);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_70._1_7_,local_70[0]) != &local_60) {
        operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT71(local_70._1_7_,local_70[0]),local_60._M_allocated_capacity + 1);
      }
      if (local_90._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_90._M_head_impl + 8))();
      }
      if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_80,local_80);
      }
    }
    bVar1 = protobuf::internal::ExtensionSet::Has
                      (&(this->_impl_)._extensions_,proto2_unittest::optional_sint64_extension);
    local_88._M_head_impl._0_1_ = (internal)!bVar1;
    local_80 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (bVar1) {
      testing::Message::Message((Message *)&local_90);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_70,(internal *)&local_88,
                 (AssertionResult *)"message.HasExtension(Traits::optional_sint64_extension)","true"
                 ,"false",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_78,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                 ,0xc61,(char *)CONCAT71(local_70._1_7_,local_70[0]));
      testing::internal::AssertHelper::operator=(&local_78,(Message *)&local_90);
      testing::internal::AssertHelper::~AssertHelper(&local_78);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_70._1_7_,local_70[0]) != &local_60) {
        operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT71(local_70._1_7_,local_70[0]),local_60._M_allocated_capacity + 1);
      }
      if (local_90._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_90._M_head_impl + 8))();
      }
      if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_80,local_80);
      }
    }
    bVar1 = protobuf::internal::ExtensionSet::Has
                      (&(this->_impl_)._extensions_,proto2_unittest::optional_fixed32_extension);
    local_88._M_head_impl._0_1_ = (internal)!bVar1;
    local_80 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (bVar1) {
      testing::Message::Message((Message *)&local_90);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_70,(internal *)&local_88,
                 (AssertionResult *)"message.HasExtension(Traits::optional_fixed32_extension)",
                 "true","false",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_78,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                 ,0xc62,(char *)CONCAT71(local_70._1_7_,local_70[0]));
      testing::internal::AssertHelper::operator=(&local_78,(Message *)&local_90);
      testing::internal::AssertHelper::~AssertHelper(&local_78);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_70._1_7_,local_70[0]) != &local_60) {
        operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT71(local_70._1_7_,local_70[0]),local_60._M_allocated_capacity + 1);
      }
      if (local_90._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_90._M_head_impl + 8))();
      }
      if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_80,local_80);
      }
    }
    bVar1 = protobuf::internal::ExtensionSet::Has
                      (&(this->_impl_)._extensions_,proto2_unittest::optional_fixed64_extension);
    local_88._M_head_impl._0_1_ = (internal)!bVar1;
    local_80 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (bVar1) {
      testing::Message::Message((Message *)&local_90);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_70,(internal *)&local_88,
                 (AssertionResult *)"message.HasExtension(Traits::optional_fixed64_extension)",
                 "true","false",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_78,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                 ,0xc63,(char *)CONCAT71(local_70._1_7_,local_70[0]));
      testing::internal::AssertHelper::operator=(&local_78,(Message *)&local_90);
      testing::internal::AssertHelper::~AssertHelper(&local_78);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_70._1_7_,local_70[0]) != &local_60) {
        operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT71(local_70._1_7_,local_70[0]),local_60._M_allocated_capacity + 1);
      }
      if (local_90._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_90._M_head_impl + 8))();
      }
      if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_80,local_80);
      }
    }
    bVar1 = protobuf::internal::ExtensionSet::Has
                      (&(this->_impl_)._extensions_,proto2_unittest::optional_sfixed32_extension);
    local_88._M_head_impl._0_1_ = (internal)!bVar1;
    local_80 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (bVar1) {
      testing::Message::Message((Message *)&local_90);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_70,(internal *)&local_88,
                 (AssertionResult *)"message.HasExtension(Traits::optional_sfixed32_extension)",
                 "true","false",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_78,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                 ,0xc64,(char *)CONCAT71(local_70._1_7_,local_70[0]));
      testing::internal::AssertHelper::operator=(&local_78,(Message *)&local_90);
      testing::internal::AssertHelper::~AssertHelper(&local_78);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_70._1_7_,local_70[0]) != &local_60) {
        operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT71(local_70._1_7_,local_70[0]),local_60._M_allocated_capacity + 1);
      }
      if (local_90._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_90._M_head_impl + 8))();
      }
      if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_80,local_80);
      }
    }
    bVar1 = protobuf::internal::ExtensionSet::Has
                      (&(this->_impl_)._extensions_,proto2_unittest::optional_sfixed64_extension);
    local_88._M_head_impl._0_1_ = (internal)!bVar1;
    local_80 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (bVar1) {
      testing::Message::Message((Message *)&local_90);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_70,(internal *)&local_88,
                 (AssertionResult *)"message.HasExtension(Traits::optional_sfixed64_extension)",
                 "true","false",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_78,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                 ,0xc65,(char *)CONCAT71(local_70._1_7_,local_70[0]));
      testing::internal::AssertHelper::operator=(&local_78,(Message *)&local_90);
      testing::internal::AssertHelper::~AssertHelper(&local_78);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_70._1_7_,local_70[0]) != &local_60) {
        operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT71(local_70._1_7_,local_70[0]),local_60._M_allocated_capacity + 1);
      }
      if (local_90._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_90._M_head_impl + 8))();
      }
      if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_80,local_80);
      }
    }
    bVar1 = protobuf::internal::ExtensionSet::Has
                      (&(this->_impl_)._extensions_,proto2_unittest::optional_float_extension);
    local_88._M_head_impl._0_1_ = (internal)!bVar1;
    local_80 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (bVar1) {
      testing::Message::Message((Message *)&local_90);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_70,(internal *)&local_88,
                 (AssertionResult *)"message.HasExtension(Traits::optional_float_extension)","true",
                 "false",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_78,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                 ,0xc66,(char *)CONCAT71(local_70._1_7_,local_70[0]));
      testing::internal::AssertHelper::operator=(&local_78,(Message *)&local_90);
      testing::internal::AssertHelper::~AssertHelper(&local_78);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_70._1_7_,local_70[0]) != &local_60) {
        operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT71(local_70._1_7_,local_70[0]),local_60._M_allocated_capacity + 1);
      }
      if (local_90._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_90._M_head_impl + 8))();
      }
      if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_80,local_80);
      }
    }
    bVar1 = protobuf::internal::ExtensionSet::Has
                      (&(this->_impl_)._extensions_,proto2_unittest::optional_double_extension);
    local_88._M_head_impl._0_1_ = (internal)!bVar1;
    local_80 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (bVar1) {
      testing::Message::Message((Message *)&local_90);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_70,(internal *)&local_88,
                 (AssertionResult *)"message.HasExtension(Traits::optional_double_extension)","true"
                 ,"false",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_78,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                 ,0xc67,(char *)CONCAT71(local_70._1_7_,local_70[0]));
      testing::internal::AssertHelper::operator=(&local_78,(Message *)&local_90);
      testing::internal::AssertHelper::~AssertHelper(&local_78);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_70._1_7_,local_70[0]) != &local_60) {
        operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT71(local_70._1_7_,local_70[0]),local_60._M_allocated_capacity + 1);
      }
      if (local_90._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_90._M_head_impl + 8))();
      }
      if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_80,local_80);
      }
    }
    bVar1 = protobuf::internal::ExtensionSet::Has
                      (&(this->_impl_)._extensions_,proto2_unittest::optional_bool_extension);
    local_88._M_head_impl._0_1_ = (internal)!bVar1;
    local_80 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (bVar1) {
      testing::Message::Message((Message *)&local_90);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_70,(internal *)&local_88,
                 (AssertionResult *)"message.HasExtension(Traits::optional_bool_extension)","true",
                 "false",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_78,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                 ,0xc68,(char *)CONCAT71(local_70._1_7_,local_70[0]));
      testing::internal::AssertHelper::operator=(&local_78,(Message *)&local_90);
      testing::internal::AssertHelper::~AssertHelper(&local_78);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_70._1_7_,local_70[0]) != &local_60) {
        operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT71(local_70._1_7_,local_70[0]),local_60._M_allocated_capacity + 1);
      }
      if (local_90._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_90._M_head_impl + 8))();
      }
      if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_80,local_80);
      }
    }
    bVar1 = protobuf::internal::ExtensionSet::Has
                      (&(this->_impl_)._extensions_,proto2_unittest::optional_string_extension);
    local_88._M_head_impl._0_1_ = (internal)!bVar1;
    local_80 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (bVar1) {
      testing::Message::Message((Message *)&local_90);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_70,(internal *)&local_88,
                 (AssertionResult *)"message.HasExtension(Traits::optional_string_extension)","true"
                 ,"false",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_78,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                 ,0xc69,(char *)CONCAT71(local_70._1_7_,local_70[0]));
      testing::internal::AssertHelper::operator=(&local_78,(Message *)&local_90);
      testing::internal::AssertHelper::~AssertHelper(&local_78);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_70._1_7_,local_70[0]) != &local_60) {
        operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT71(local_70._1_7_,local_70[0]),local_60._M_allocated_capacity + 1);
      }
      if (local_90._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_90._M_head_impl + 8))();
      }
      if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_80,local_80);
      }
    }
    bVar1 = protobuf::internal::ExtensionSet::Has
                      (&(this->_impl_)._extensions_,proto2_unittest::optional_bytes_extension);
    local_88._M_head_impl._0_1_ = (internal)!bVar1;
    local_80 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (bVar1) {
      testing::Message::Message((Message *)&local_90);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_70,(internal *)&local_88,
                 (AssertionResult *)"message.HasExtension(Traits::optional_bytes_extension)","true",
                 "false",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_78,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                 ,0xc6a,(char *)CONCAT71(local_70._1_7_,local_70[0]));
      testing::internal::AssertHelper::operator=(&local_78,(Message *)&local_90);
      testing::internal::AssertHelper::~AssertHelper(&local_78);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_70._1_7_,local_70[0]) != &local_60) {
        operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT71(local_70._1_7_,local_70[0]),local_60._M_allocated_capacity + 1);
      }
      if (local_90._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_90._M_head_impl + 8))();
      }
      if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_80,local_80);
      }
    }
    bVar1 = protobuf::internal::ExtensionSet::Has
                      (&(this->_impl_)._extensions_,proto2_unittest::optionalgroup_extension);
    local_88._M_head_impl._0_1_ = (internal)!bVar1;
    local_80 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (bVar1) {
      testing::Message::Message((Message *)&local_90);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_70,(internal *)&local_88,
                 (AssertionResult *)"message.HasExtension(Traits::optionalgroup_extension)","true",
                 "false",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_78,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                 ,0xc6c,(char *)CONCAT71(local_70._1_7_,local_70[0]));
      testing::internal::AssertHelper::operator=(&local_78,(Message *)&local_90);
      testing::internal::AssertHelper::~AssertHelper(&local_78);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_70._1_7_,local_70[0]) != &local_60) {
        operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT71(local_70._1_7_,local_70[0]),local_60._M_allocated_capacity + 1);
      }
      if (local_90._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_90._M_head_impl + 8))();
      }
      if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_80,local_80);
      }
    }
    bVar1 = protobuf::internal::ExtensionSet::Has
                      (&(this->_impl_)._extensions_,
                       proto2_unittest::optional_nested_message_extension);
    local_88._M_head_impl._0_1_ = (internal)!bVar1;
    local_80 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (bVar1) {
      testing::Message::Message((Message *)&local_90);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_70,(internal *)&local_88,
                 (AssertionResult *)
                 "message.HasExtension(Traits::optional_nested_message_extension)","true","false",
                 in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_78,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                 ,0xc6d,(char *)CONCAT71(local_70._1_7_,local_70[0]));
      testing::internal::AssertHelper::operator=(&local_78,(Message *)&local_90);
      testing::internal::AssertHelper::~AssertHelper(&local_78);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_70._1_7_,local_70[0]) != &local_60) {
        operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT71(local_70._1_7_,local_70[0]),local_60._M_allocated_capacity + 1);
      }
      if (local_90._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_90._M_head_impl + 8))();
      }
      if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_80,local_80);
      }
    }
    bVar1 = protobuf::internal::ExtensionSet::Has
                      (&(this->_impl_)._extensions_,
                       proto2_unittest::optional_foreign_message_extension);
    local_88._M_head_impl._0_1_ = (internal)!bVar1;
    local_80 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (bVar1) {
      testing::Message::Message((Message *)&local_90);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_70,(internal *)&local_88,
                 (AssertionResult *)
                 "message.HasExtension(Traits::optional_foreign_message_extension)","true","false",
                 in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_78,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                 ,0xc6f,(char *)CONCAT71(local_70._1_7_,local_70[0]));
      testing::internal::AssertHelper::operator=(&local_78,(Message *)&local_90);
      testing::internal::AssertHelper::~AssertHelper(&local_78);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_70._1_7_,local_70[0]) != &local_60) {
        operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT71(local_70._1_7_,local_70[0]),local_60._M_allocated_capacity + 1);
      }
      if (local_90._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_90._M_head_impl + 8))();
      }
      if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_80,local_80);
      }
    }
    bVar1 = protobuf::internal::ExtensionSet::Has
                      (&(this->_impl_)._extensions_,
                       proto2_unittest::optional_import_message_extension);
    local_88._M_head_impl._0_1_ = (internal)!bVar1;
    local_80 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (bVar1) {
      testing::Message::Message((Message *)&local_90);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_70,(internal *)&local_88,
                 (AssertionResult *)
                 "message.HasExtension(Traits::optional_import_message_extension)","true","false",
                 in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_78,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                 ,0xc70,(char *)CONCAT71(local_70._1_7_,local_70[0]));
      testing::internal::AssertHelper::operator=(&local_78,(Message *)&local_90);
      testing::internal::AssertHelper::~AssertHelper(&local_78);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_70._1_7_,local_70[0]) != &local_60) {
        operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT71(local_70._1_7_,local_70[0]),local_60._M_allocated_capacity + 1);
      }
      if (local_90._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_90._M_head_impl + 8))();
      }
      if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_80,local_80);
      }
    }
    bVar1 = protobuf::internal::ExtensionSet::Has
                      (&(this->_impl_)._extensions_,
                       proto2_unittest::optional_public_import_message_extension);
    local_88._M_head_impl._0_1_ = (internal)!bVar1;
    local_80 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (bVar1) {
      testing::Message::Message((Message *)&local_90);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_70,(internal *)&local_88,
                 (AssertionResult *)
                 "message.HasExtension(Traits::optional_public_import_message_extension)","true",
                 "false",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_78,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                 ,0xc72,(char *)CONCAT71(local_70._1_7_,local_70[0]));
      testing::internal::AssertHelper::operator=(&local_78,(Message *)&local_90);
      testing::internal::AssertHelper::~AssertHelper(&local_78);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_70._1_7_,local_70[0]) != &local_60) {
        operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT71(local_70._1_7_,local_70[0]),local_60._M_allocated_capacity + 1);
      }
      if (local_90._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_90._M_head_impl + 8))();
      }
      if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_80,local_80);
      }
    }
    bVar1 = protobuf::internal::ExtensionSet::Has
                      (&(this->_impl_)._extensions_,proto2_unittest::optional_lazy_message_extension
                      );
    local_88._M_head_impl._0_1_ = (internal)!bVar1;
    local_80 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (bVar1) {
      testing::Message::Message((Message *)&local_90);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_70,(internal *)&local_88,
                 (AssertionResult *)"message.HasExtension(Traits::optional_lazy_message_extension)",
                 "true","false",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_78,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                 ,0xc73,(char *)CONCAT71(local_70._1_7_,local_70[0]));
      testing::internal::AssertHelper::operator=(&local_78,(Message *)&local_90);
      testing::internal::AssertHelper::~AssertHelper(&local_78);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_70._1_7_,local_70[0]) != &local_60) {
        operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT71(local_70._1_7_,local_70[0]),local_60._M_allocated_capacity + 1);
      }
      if (local_90._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_90._M_head_impl + 8))();
      }
      if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_80,local_80);
      }
    }
    bVar1 = protobuf::internal::ExtensionSet::Has
                      (&(this->_impl_)._extensions_,
                       proto2_unittest::optional_unverified_lazy_message_extension);
    local_88._M_head_impl._0_1_ = (internal)!bVar1;
    local_80 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (bVar1) {
      testing::Message::Message((Message *)&local_90);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_70,(internal *)&local_88,
                 (AssertionResult *)
                 "message.HasExtension(Traits::optional_unverified_lazy_message_extension)","true",
                 "false",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_78,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                 ,0xc75,(char *)CONCAT71(local_70._1_7_,local_70[0]));
      testing::internal::AssertHelper::operator=(&local_78,(Message *)&local_90);
      testing::internal::AssertHelper::~AssertHelper(&local_78);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_70._1_7_,local_70[0]) != &local_60) {
        operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT71(local_70._1_7_,local_70[0]),local_60._M_allocated_capacity + 1);
      }
      if (local_90._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_90._M_head_impl + 8))();
      }
      if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_80,local_80);
      }
    }
    bVar1 = protobuf::internal::ExtensionSet::Has
                      (&(this->_impl_)._extensions_,proto2_unittest::optional_nested_enum_extension)
    ;
    local_88._M_head_impl._0_1_ = (internal)!bVar1;
    local_80 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (bVar1) {
      testing::Message::Message((Message *)&local_90);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_70,(internal *)&local_88,
                 (AssertionResult *)"message.HasExtension(Traits::optional_nested_enum_extension)",
                 "true","false",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_78,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                 ,0xc77,(char *)CONCAT71(local_70._1_7_,local_70[0]));
      testing::internal::AssertHelper::operator=(&local_78,(Message *)&local_90);
      testing::internal::AssertHelper::~AssertHelper(&local_78);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_70._1_7_,local_70[0]) != &local_60) {
        operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT71(local_70._1_7_,local_70[0]),local_60._M_allocated_capacity + 1);
      }
      if (local_90._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_90._M_head_impl + 8))();
      }
      if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_80,local_80);
      }
    }
    bVar1 = protobuf::internal::ExtensionSet::Has
                      (&(this->_impl_)._extensions_,proto2_unittest::optional_foreign_enum_extension
                      );
    local_88._M_head_impl._0_1_ = (internal)!bVar1;
    local_80 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (bVar1) {
      testing::Message::Message((Message *)&local_90);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_70,(internal *)&local_88,
                 (AssertionResult *)"message.HasExtension(Traits::optional_foreign_enum_extension)",
                 "true","false",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_78,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                 ,0xc78,(char *)CONCAT71(local_70._1_7_,local_70[0]));
      testing::internal::AssertHelper::operator=(&local_78,(Message *)&local_90);
      testing::internal::AssertHelper::~AssertHelper(&local_78);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_70._1_7_,local_70[0]) != &local_60) {
        operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT71(local_70._1_7_,local_70[0]),local_60._M_allocated_capacity + 1);
      }
      if (local_90._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_90._M_head_impl + 8))();
      }
      if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_80,local_80);
      }
    }
    bVar1 = protobuf::internal::ExtensionSet::Has
                      (&(this->_impl_)._extensions_,proto2_unittest::optional_import_enum_extension)
    ;
    local_88._M_head_impl._0_1_ = (internal)!bVar1;
    local_80 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (bVar1) {
      testing::Message::Message((Message *)&local_90);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_70,(internal *)&local_88,
                 (AssertionResult *)"message.HasExtension(Traits::optional_import_enum_extension)",
                 "true","false",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_78,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                 ,0xc79,(char *)CONCAT71(local_70._1_7_,local_70[0]));
      testing::internal::AssertHelper::operator=(&local_78,(Message *)&local_90);
      testing::internal::AssertHelper::~AssertHelper(&local_78);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_70._1_7_,local_70[0]) != &local_60) {
        operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT71(local_70._1_7_,local_70[0]),local_60._M_allocated_capacity + 1);
      }
      if (local_90._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_90._M_head_impl + 8))();
      }
      if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_80,local_80);
      }
    }
    bVar1 = protobuf::internal::ExtensionSet::Has
                      (&(this->_impl_)._extensions_,proto2_unittest::optional_string_piece_extension
                      );
    local_88._M_head_impl._0_1_ = (internal)!bVar1;
    local_80 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (bVar1) {
      testing::Message::Message((Message *)&local_90);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_70,(internal *)&local_88,
                 (AssertionResult *)"message.HasExtension(Traits::optional_string_piece_extension)",
                 "true","false",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_78,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                 ,0xc7b,(char *)CONCAT71(local_70._1_7_,local_70[0]));
      testing::internal::AssertHelper::operator=(&local_78,(Message *)&local_90);
      testing::internal::AssertHelper::~AssertHelper(&local_78);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_70._1_7_,local_70[0]) != &local_60) {
        operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT71(local_70._1_7_,local_70[0]),local_60._M_allocated_capacity + 1);
      }
      if (local_90._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_90._M_head_impl + 8))();
      }
      if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_80,local_80);
      }
    }
    bVar1 = protobuf::internal::ExtensionSet::Has
                      (&(this->_impl_)._extensions_,proto2_unittest::optional_cord_extension);
    local_88._M_head_impl._0_1_ = (internal)!bVar1;
    local_80 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (bVar1) {
      testing::Message::Message((Message *)&local_90);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_70,(internal *)&local_88,
                 (AssertionResult *)"message.HasExtension(Traits::optional_cord_extension)","true",
                 "false",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_78,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                 ,0xc7c,(char *)CONCAT71(local_70._1_7_,local_70[0]));
      testing::internal::AssertHelper::operator=(&local_78,(Message *)&local_90);
      testing::internal::AssertHelper::~AssertHelper(&local_78);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_70._1_7_,local_70[0]) != &local_60) {
        operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT71(local_70._1_7_,local_70[0]),local_60._M_allocated_capacity + 1);
      }
      if (local_90._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_90._M_head_impl + 8))();
      }
      if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_80,local_80);
      }
    }
    bVar1 = protobuf::internal::ExtensionSet::Has
                      (&(this->_impl_)._extensions_,proto2_unittest::optional_bytes_cord_extension);
    local_88._M_head_impl._0_1_ = (internal)!bVar1;
    local_80 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (bVar1) {
      testing::Message::Message((Message *)&local_90);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_70,(internal *)&local_88,
                 (AssertionResult *)"message.HasExtension(Traits::optional_bytes_cord_extension)",
                 "true","false",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_78,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                 ,0xc7d,(char *)CONCAT71(local_70._1_7_,local_70[0]));
      testing::internal::AssertHelper::operator=(&local_78,(Message *)&local_90);
      testing::internal::AssertHelper::~AssertHelper(&local_78);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_70._1_7_,local_70[0]) != &local_60) {
        operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT71(local_70._1_7_,local_70[0]),local_60._M_allocated_capacity + 1);
      }
      if (local_90._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_90._M_head_impl + 8))();
      }
      if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_80,local_80);
      }
    }
    local_88._M_head_impl = local_88._M_head_impl & 0xffffffff00000000;
    iVar2 = protobuf::internal::ExtensionSet::GetInt32
                      (&(this->_impl_)._extensions_,proto2_unittest::optional_int32_extension,
                       DAT_01945034);
    local_90._M_head_impl._0_4_ = (float)iVar2;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)local_70,"0","message.GetExtension(Traits::optional_int32_extension)",
               (int *)&local_88,(int *)&local_90);
    if (local_70[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_88);
      if (local_68 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar8 = anon_var_dwarf_a22956 + 5;
      }
      else {
        pcVar8 = (local_68->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_90,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                 ,0xc80,pcVar8);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_90,(Message *)&local_88);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_90);
      if (local_88._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_88._M_head_impl + 8))();
      }
    }
    if (local_68 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_68,local_68);
    }
    local_90._M_head_impl = local_90._M_head_impl & 0xffffffff00000000;
    local_88._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
         protobuf::internal::ExtensionSet::GetInt64
                   (&(this->_impl_)._extensions_,proto2_unittest::optional_int64_extension,
                    DAT_01945040);
    testing::internal::CmpHelperEQ<int,long>
              ((internal *)local_70,"0","message.GetExtension(Traits::optional_int64_extension)",
               (int *)&local_90,(long *)&local_88);
    if (local_70[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_88);
      if (local_68 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar8 = anon_var_dwarf_a22956 + 5;
      }
      else {
        pcVar8 = (local_68->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_90,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                 ,0xc81,pcVar8);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_90,(Message *)&local_88);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_90);
      if (local_88._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_88._M_head_impl + 8))();
      }
    }
    if (local_68 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_68,local_68);
    }
    local_88._M_head_impl = local_88._M_head_impl & 0xffffffff00000000;
    uVar3 = protobuf::internal::ExtensionSet::GetUInt32
                      (&(this->_impl_)._extensions_,proto2_unittest::optional_uint32_extension,
                       DAT_0194504c);
    local_90._M_head_impl._0_4_ = (float)uVar3;
    testing::internal::CmpHelperEQ<int,unsigned_int>
              ((internal *)local_70,"0","message.GetExtension(Traits::optional_uint32_extension)",
               (int *)&local_88,(uint *)&local_90);
    if (local_70[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_88);
      if (local_68 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar8 = anon_var_dwarf_a22956 + 5;
      }
      else {
        pcVar8 = (local_68->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_90,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                 ,0xc82,pcVar8);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_90,(Message *)&local_88);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_90);
      if (local_88._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_88._M_head_impl + 8))();
      }
    }
    if (local_68 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_68,local_68);
    }
    local_90._M_head_impl = local_90._M_head_impl & 0xffffffff00000000;
    local_88._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
         protobuf::internal::ExtensionSet::GetUInt64
                   (&(this->_impl_)._extensions_,proto2_unittest::optional_uint64_extension,
                    DAT_01945058);
    testing::internal::CmpHelperEQ<int,unsigned_long>
              ((internal *)local_70,"0","message.GetExtension(Traits::optional_uint64_extension)",
               (int *)&local_90,(unsigned_long *)&local_88);
    if (local_70[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_88);
      if (local_68 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar8 = anon_var_dwarf_a22956 + 5;
      }
      else {
        pcVar8 = (local_68->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_90,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                 ,0xc83,pcVar8);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_90,(Message *)&local_88);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_90);
      if (local_88._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_88._M_head_impl + 8))();
      }
    }
    if (local_68 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_68,local_68);
    }
    local_88._M_head_impl = local_88._M_head_impl & 0xffffffff00000000;
    iVar2 = protobuf::internal::ExtensionSet::GetInt32
                      (&(this->_impl_)._extensions_,proto2_unittest::optional_sint32_extension,
                       DAT_01945064);
    local_90._M_head_impl._0_4_ = (float)iVar2;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)local_70,"0","message.GetExtension(Traits::optional_sint32_extension)",
               (int *)&local_88,(int *)&local_90);
    if (local_70[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_88);
      if (local_68 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar8 = anon_var_dwarf_a22956 + 5;
      }
      else {
        pcVar8 = (local_68->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_90,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                 ,0xc84,pcVar8);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_90,(Message *)&local_88);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_90);
      if (local_88._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_88._M_head_impl + 8))();
      }
    }
    if (local_68 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_68,local_68);
    }
    local_90._M_head_impl = local_90._M_head_impl & 0xffffffff00000000;
    local_88._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
         protobuf::internal::ExtensionSet::GetInt64
                   (&(this->_impl_)._extensions_,proto2_unittest::optional_sint64_extension,
                    DAT_01945070);
    testing::internal::CmpHelperEQ<int,long>
              ((internal *)local_70,"0","message.GetExtension(Traits::optional_sint64_extension)",
               (int *)&local_90,(long *)&local_88);
    if (local_70[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_88);
      if (local_68 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar8 = anon_var_dwarf_a22956 + 5;
      }
      else {
        pcVar8 = (local_68->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_90,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                 ,0xc85,pcVar8);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_90,(Message *)&local_88);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_90);
      if (local_88._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_88._M_head_impl + 8))();
      }
    }
    if (local_68 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_68,local_68);
    }
    local_88._M_head_impl = local_88._M_head_impl & 0xffffffff00000000;
    uVar3 = protobuf::internal::ExtensionSet::GetUInt32
                      (&(this->_impl_)._extensions_,proto2_unittest::optional_fixed32_extension,
                       DAT_0194507c);
    local_90._M_head_impl._0_4_ = (float)uVar3;
    testing::internal::CmpHelperEQ<int,unsigned_int>
              ((internal *)local_70,"0","message.GetExtension(Traits::optional_fixed32_extension)",
               (int *)&local_88,(uint *)&local_90);
    if (local_70[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_88);
      if (local_68 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar8 = anon_var_dwarf_a22956 + 5;
      }
      else {
        pcVar8 = (local_68->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_90,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                 ,0xc86,pcVar8);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_90,(Message *)&local_88);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_90);
      if (local_88._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_88._M_head_impl + 8))();
      }
    }
    if (local_68 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_68,local_68);
    }
    local_90._M_head_impl = local_90._M_head_impl & 0xffffffff00000000;
    local_88._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
         protobuf::internal::ExtensionSet::GetUInt64
                   (&(this->_impl_)._extensions_,proto2_unittest::optional_fixed64_extension,
                    DAT_01945088);
    testing::internal::CmpHelperEQ<int,unsigned_long>
              ((internal *)local_70,"0","message.GetExtension(Traits::optional_fixed64_extension)",
               (int *)&local_90,(unsigned_long *)&local_88);
    if (local_70[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_88);
      if (local_68 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar8 = anon_var_dwarf_a22956 + 5;
      }
      else {
        pcVar8 = (local_68->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_90,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                 ,0xc87,pcVar8);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_90,(Message *)&local_88);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_90);
      if (local_88._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_88._M_head_impl + 8))();
      }
    }
    if (local_68 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_68,local_68);
    }
    local_88._M_head_impl = local_88._M_head_impl & 0xffffffff00000000;
    iVar2 = protobuf::internal::ExtensionSet::GetInt32
                      (&(this->_impl_)._extensions_,proto2_unittest::optional_sfixed32_extension,
                       DAT_01945094);
    local_90._M_head_impl._0_4_ = (float)iVar2;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)local_70,"0","message.GetExtension(Traits::optional_sfixed32_extension)",
               (int *)&local_88,(int *)&local_90);
    if (local_70[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_88);
      if (local_68 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar8 = anon_var_dwarf_a22956 + 5;
      }
      else {
        pcVar8 = (local_68->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_90,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                 ,0xc88,pcVar8);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_90,(Message *)&local_88);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_90);
      if (local_88._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_88._M_head_impl + 8))();
      }
    }
    if (local_68 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_68,local_68);
    }
    local_90._M_head_impl = local_90._M_head_impl & 0xffffffff00000000;
    local_88._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
         protobuf::internal::ExtensionSet::GetInt64
                   (&(this->_impl_)._extensions_,proto2_unittest::optional_sfixed64_extension,
                    DAT_019450a0);
    testing::internal::CmpHelperEQ<int,long>
              ((internal *)local_70,"0","message.GetExtension(Traits::optional_sfixed64_extension)",
               (int *)&local_90,(long *)&local_88);
    if (local_70[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_88);
      if (local_68 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar8 = anon_var_dwarf_a22956 + 5;
      }
      else {
        pcVar8 = (local_68->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_90,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                 ,0xc89,pcVar8);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_90,(Message *)&local_88);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_90);
      if (local_88._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_88._M_head_impl + 8))();
      }
    }
    if (local_68 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_68,local_68);
    }
    local_88._M_head_impl = local_88._M_head_impl & 0xffffffff00000000;
    fVar9 = protobuf::internal::ExtensionSet::GetFloat
                      (&(this->_impl_)._extensions_,proto2_unittest::optional_float_extension,
                       DAT_019450ac);
    local_90._M_head_impl._0_4_ = fVar9;
    testing::internal::CmpHelperEQ<int,float>
              ((internal *)local_70,"0","message.GetExtension(Traits::optional_float_extension)",
               (int *)&local_88,(float *)&local_90);
    if (local_70[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_88);
      if (local_68 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar8 = anon_var_dwarf_a22956 + 5;
      }
      else {
        pcVar8 = (local_68->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_90,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                 ,0xc8a,pcVar8);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_90,(Message *)&local_88);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_90);
      if (local_88._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_88._M_head_impl + 8))();
      }
    }
    if (local_68 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_68,local_68);
    }
    local_90._M_head_impl = local_90._M_head_impl & 0xffffffff00000000;
    local_88._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
         protobuf::internal::ExtensionSet::GetDouble
                   (&(this->_impl_)._extensions_,proto2_unittest::optional_double_extension,
                    DAT_019450b8);
    testing::internal::CmpHelperEQ<int,double>
              ((internal *)local_70,"0","message.GetExtension(Traits::optional_double_extension)",
               (int *)&local_90,(double *)&local_88);
    if (local_70[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_88);
      if (local_68 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar8 = anon_var_dwarf_a22956 + 5;
      }
      else {
        pcVar8 = (local_68->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_90,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                 ,0xc8b,pcVar8);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_90,(Message *)&local_88);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_90);
      if (local_88._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_88._M_head_impl + 8))();
      }
    }
    if (local_68 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_68,local_68);
    }
    bVar1 = protobuf::internal::ExtensionSet::GetBool
                      (&(this->_impl_)._extensions_,proto2_unittest::optional_bool_extension,
                       (bool)DAT_019450c4);
    local_88._M_head_impl._0_1_ = (internal)!bVar1;
    local_80 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (bVar1) {
      testing::Message::Message((Message *)&local_90);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_70,(internal *)&local_88,
                 (AssertionResult *)"message.GetExtension(Traits::optional_bool_extension)","true",
                 "false",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_78,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                 ,0xc8c,(char *)CONCAT71(local_70._1_7_,local_70[0]));
      testing::internal::AssertHelper::operator=(&local_78,(Message *)&local_90);
      testing::internal::AssertHelper::~AssertHelper(&local_78);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_70._1_7_,local_70[0]) != &local_60) {
        operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT71(local_70._1_7_,local_70[0]),local_60._M_allocated_capacity + 1);
      }
      if (local_90._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_90._M_head_impl + 8))();
      }
      if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_80,local_80);
      }
    }
    psVar6 = protobuf::internal::ExtensionSet::GetString
                       (&(this->_impl_)._extensions_,proto2_unittest::optional_string_extension,
                        (string *)PTR_optional_string_extension_default_abi_cxx11__019450d0);
    pcVar8 = anon_var_dwarf_a22956 + 5;
    testing::internal::CmpHelperEQ<char[1],std::__cxx11::string>
              ((internal *)local_70,"\"\"","message.GetExtension(Traits::optional_string_extension)"
               ,(char (*) [1])(anon_var_dwarf_a22956 + 5),psVar6);
    if (local_70[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_88);
      if (local_68 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar8 = (local_68->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_90,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                 ,0xc8d,pcVar8);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_90,(Message *)&local_88);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_90);
      if (local_88._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_88._M_head_impl + 8))();
      }
    }
    if (local_68 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_68,local_68);
    }
    psVar6 = protobuf::internal::ExtensionSet::GetString
                       (&(this->_impl_)._extensions_,proto2_unittest::optional_bytes_extension,
                        (string *)PTR_optional_bytes_extension_default_abi_cxx11__019450e0);
    pcVar8 = anon_var_dwarf_a22956 + 5;
    testing::internal::CmpHelperEQ<char[1],std::__cxx11::string>
              ((internal *)local_70,"\"\"","message.GetExtension(Traits::optional_bytes_extension)",
               (char (*) [1])(anon_var_dwarf_a22956 + 5),psVar6);
    if (local_70[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_88);
      if (local_68 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar8 = (local_68->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_90,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                 ,0xc8e,pcVar8);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_90,(Message *)&local_88);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_90);
      if (local_88._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_88._M_head_impl + 8))();
      }
    }
    if (local_68 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_68,local_68);
    }
    pMVar7 = protobuf::internal::ExtensionSet::GetMessage
                       (&(this->_impl_)._extensions_,proto2_unittest::optionalgroup_extension,
                        (MessageLite *)PTR__OptionalGroup_extension_default_instance__019450f0);
    uVar4 = *(uint *)&pMVar7[1]._vptr_MessageLite & 1;
    local_88._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
         (CONCAT71(local_88._M_head_impl._1_7_,(char)uVar4) ^ 1);
    local_80 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (uVar4 != 0) {
      testing::Message::Message((Message *)&local_90);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_70,(internal *)&local_88,
                 (AssertionResult *)"message.GetExtension(Traits::optionalgroup_extension).has_a()",
                 "true","false",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_78,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                 ,0xc91,(char *)CONCAT71(local_70._1_7_,local_70[0]));
      testing::internal::AssertHelper::operator=(&local_78,(Message *)&local_90);
      testing::internal::AssertHelper::~AssertHelper(&local_78);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_70._1_7_,local_70[0]) != &local_60) {
        operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT71(local_70._1_7_,local_70[0]),local_60._M_allocated_capacity + 1);
      }
      if (local_90._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_90._M_head_impl + 8))();
      }
      if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_80,local_80);
      }
    }
    pMVar7 = protobuf::internal::ExtensionSet::GetMessage
                       (&(this->_impl_)._extensions_,
                        proto2_unittest::optional_nested_message_extension,
                        (MessageLite *)PTR__TestAllTypes_NestedMessage_default_instance__01945100);
    uVar4 = *(uint *)&pMVar7[1]._vptr_MessageLite & 1;
    local_88._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
         (CONCAT71(local_88._M_head_impl._1_7_,(char)uVar4) ^ 1);
    local_80 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (uVar4 != 0) {
      testing::Message::Message((Message *)&local_90);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_70,(internal *)&local_88,
                 (AssertionResult *)
                 "message.GetExtension(Traits::optional_nested_message_extension).has_bb()","true",
                 "false",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_78,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                 ,0xc93,(char *)CONCAT71(local_70._1_7_,local_70[0]));
      testing::internal::AssertHelper::operator=(&local_78,(Message *)&local_90);
      testing::internal::AssertHelper::~AssertHelper(&local_78);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_70._1_7_,local_70[0]) != &local_60) {
        operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT71(local_70._1_7_,local_70[0]),local_60._M_allocated_capacity + 1);
      }
      if (local_90._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_90._M_head_impl + 8))();
      }
      if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_80,local_80);
      }
    }
    pMVar7 = protobuf::internal::ExtensionSet::GetMessage
                       (&(this->_impl_)._extensions_,
                        proto2_unittest::optional_foreign_message_extension,
                        (MessageLite *)PTR__ForeignMessage_default_instance__01945110);
    uVar4 = *(uint *)&pMVar7[1]._vptr_MessageLite & 1;
    local_88._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
         (CONCAT71(local_88._M_head_impl._1_7_,(char)uVar4) ^ 1);
    local_80 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (uVar4 != 0) {
      testing::Message::Message((Message *)&local_90);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_70,(internal *)&local_88,
                 (AssertionResult *)
                 "message.GetExtension(Traits::optional_foreign_message_extension).has_c()","true",
                 "false",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_78,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                 ,0xc95,(char *)CONCAT71(local_70._1_7_,local_70[0]));
      testing::internal::AssertHelper::operator=(&local_78,(Message *)&local_90);
      testing::internal::AssertHelper::~AssertHelper(&local_78);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_70._1_7_,local_70[0]) != &local_60) {
        operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT71(local_70._1_7_,local_70[0]),local_60._M_allocated_capacity + 1);
      }
      if (local_90._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_90._M_head_impl + 8))();
      }
      if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_80,local_80);
      }
    }
    pMVar7 = protobuf::internal::ExtensionSet::GetMessage
                       (&(this->_impl_)._extensions_,
                        proto2_unittest::optional_import_message_extension,
                        (MessageLite *)PTR__ImportMessage_default_instance__01945120);
    uVar4 = *(uint *)&pMVar7[1]._vptr_MessageLite & 1;
    local_88._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
         (CONCAT71(local_88._M_head_impl._1_7_,(char)uVar4) ^ 1);
    local_80 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (uVar4 != 0) {
      testing::Message::Message((Message *)&local_90);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_70,(internal *)&local_88,
                 (AssertionResult *)
                 "message.GetExtension(Traits::optional_import_message_extension).has_d()","true",
                 "false",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_78,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                 ,0xc97,(char *)CONCAT71(local_70._1_7_,local_70[0]));
      testing::internal::AssertHelper::operator=(&local_78,(Message *)&local_90);
      testing::internal::AssertHelper::~AssertHelper(&local_78);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_70._1_7_,local_70[0]) != &local_60) {
        operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT71(local_70._1_7_,local_70[0]),local_60._M_allocated_capacity + 1);
      }
      if (local_90._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_90._M_head_impl + 8))();
      }
      if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_80,local_80);
      }
    }
    pMVar7 = protobuf::internal::ExtensionSet::GetMessage
                       (&(this->_impl_)._extensions_,
                        proto2_unittest::optional_public_import_message_extension,
                        (MessageLite *)PTR__PublicImportMessage_default_instance__01945178);
    uVar4 = *(uint *)&pMVar7[1]._vptr_MessageLite & 1;
    local_88._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
         (CONCAT71(local_88._M_head_impl._1_7_,(char)uVar4) ^ 1);
    local_80 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (uVar4 != 0) {
      testing::Message::Message((Message *)&local_90);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_70,(internal *)&local_88,
                 (AssertionResult *)
                 "message.GetExtension(Traits::optional_public_import_message_extension) .has_e()",
                 "true","false",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_78,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                 ,0xc9a,(char *)CONCAT71(local_70._1_7_,local_70[0]));
      testing::internal::AssertHelper::operator=(&local_78,(Message *)&local_90);
      testing::internal::AssertHelper::~AssertHelper(&local_78);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_70._1_7_,local_70[0]) != &local_60) {
        operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT71(local_70._1_7_,local_70[0]),local_60._M_allocated_capacity + 1);
      }
      if (local_90._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_90._M_head_impl + 8))();
      }
      if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_80,local_80);
      }
    }
    pMVar7 = protobuf::internal::ExtensionSet::GetMessage
                       (&(this->_impl_)._extensions_,
                        proto2_unittest::optional_lazy_message_extension,
                        (MessageLite *)PTR__TestAllTypes_NestedMessage_default_instance__01945188);
    uVar4 = *(uint *)&pMVar7[1]._vptr_MessageLite & 1;
    local_88._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
         (CONCAT71(local_88._M_head_impl._1_7_,(char)uVar4) ^ 1);
    local_80 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (uVar4 != 0) {
      testing::Message::Message((Message *)&local_90);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_70,(internal *)&local_88,
                 (AssertionResult *)
                 "message.GetExtension(Traits::optional_lazy_message_extension).has_bb()","true",
                 "false",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_78,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                 ,0xc9c,(char *)CONCAT71(local_70._1_7_,local_70[0]));
      testing::internal::AssertHelper::operator=(&local_78,(Message *)&local_90);
      testing::internal::AssertHelper::~AssertHelper(&local_78);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_70._1_7_,local_70[0]) != &local_60) {
        operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT71(local_70._1_7_,local_70[0]),local_60._M_allocated_capacity + 1);
      }
      if (local_90._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_90._M_head_impl + 8))();
      }
      if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_80,local_80);
      }
    }
    pMVar7 = protobuf::internal::ExtensionSet::GetMessage
                       (&(this->_impl_)._extensions_,
                        proto2_unittest::optional_unverified_lazy_message_extension,
                        (MessageLite *)PTR__TestAllTypes_NestedMessage_default_instance__01945198);
    uVar4 = *(uint *)&pMVar7[1]._vptr_MessageLite & 1;
    local_88._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
         (CONCAT71(local_88._M_head_impl._1_7_,(char)uVar4) ^ 1);
    local_80 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (uVar4 != 0) {
      testing::Message::Message((Message *)&local_90);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_70,(internal *)&local_88,
                 (AssertionResult *)
                 "message.GetExtension(Traits::optional_unverified_lazy_message_extension) .has_bb()"
                 ,"true","false",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_78,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                 ,0xc9f,(char *)CONCAT71(local_70._1_7_,local_70[0]));
      testing::internal::AssertHelper::operator=(&local_78,(Message *)&local_90);
      testing::internal::AssertHelper::~AssertHelper(&local_78);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_70._1_7_,local_70[0]) != &local_60) {
        operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT71(local_70._1_7_,local_70[0]),local_60._M_allocated_capacity + 1);
      }
      if (local_90._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_90._M_head_impl + 8))();
      }
      if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_80,local_80);
      }
    }
    local_88._M_head_impl = local_88._M_head_impl & 0xffffffff00000000;
    pMVar7 = protobuf::internal::ExtensionSet::GetMessage
                       (&(this->_impl_)._extensions_,proto2_unittest::optionalgroup_extension,
                        (MessageLite *)PTR__OptionalGroup_extension_default_instance__019450f0);
    local_90._M_head_impl._0_4_ = (float)(int)pMVar7[1]._internal_metadata_.ptr_;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)local_70,"0","message.GetExtension(Traits::optionalgroup_extension).a()",
               (int *)&local_88,(int *)&local_90);
    if (local_70[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_88);
      if (local_68 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar8 = anon_var_dwarf_a22956 + 5;
      }
      else {
        pcVar8 = (local_68->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_90,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                 ,0xca1,pcVar8);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_90,(Message *)&local_88);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_90);
      if (local_88._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_88._M_head_impl + 8))();
      }
    }
    if (local_68 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_68,local_68);
    }
    local_88._M_head_impl = local_88._M_head_impl & 0xffffffff00000000;
    pMVar7 = protobuf::internal::ExtensionSet::GetMessage
                       (&(this->_impl_)._extensions_,
                        proto2_unittest::optional_nested_message_extension,
                        (MessageLite *)PTR__TestAllTypes_NestedMessage_default_instance__01945100);
    local_90._M_head_impl._0_4_ = (float)(int)pMVar7[1]._internal_metadata_.ptr_;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)local_70,"0",
               "message.GetExtension(Traits::optional_nested_message_extension).bb()",
               (int *)&local_88,(int *)&local_90);
    if (local_70[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_88);
      if (local_68 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar8 = anon_var_dwarf_a22956 + 5;
      }
      else {
        pcVar8 = (local_68->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_90,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                 ,0xca3,pcVar8);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_90,(Message *)&local_88);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_90);
      if (local_88._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_88._M_head_impl + 8))();
      }
    }
    if (local_68 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_68,local_68);
    }
    local_88._M_head_impl = local_88._M_head_impl & 0xffffffff00000000;
    pMVar7 = protobuf::internal::ExtensionSet::GetMessage
                       (&(this->_impl_)._extensions_,
                        proto2_unittest::optional_foreign_message_extension,
                        (MessageLite *)PTR__ForeignMessage_default_instance__01945110);
    local_90._M_head_impl._0_4_ = (float)(int)pMVar7[1]._internal_metadata_.ptr_;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)local_70,"0",
               "message.GetExtension(Traits::optional_foreign_message_extension).c()",
               (int *)&local_88,(int *)&local_90);
    if (local_70[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_88);
      if (local_68 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar8 = anon_var_dwarf_a22956 + 5;
      }
      else {
        pcVar8 = (local_68->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_90,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                 ,0xca5,pcVar8);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_90,(Message *)&local_88);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_90);
      if (local_88._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_88._M_head_impl + 8))();
      }
    }
    if (local_68 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_68,local_68);
    }
    local_88._M_head_impl = local_88._M_head_impl & 0xffffffff00000000;
    pMVar7 = protobuf::internal::ExtensionSet::GetMessage
                       (&(this->_impl_)._extensions_,
                        proto2_unittest::optional_import_message_extension,
                        (MessageLite *)PTR__ImportMessage_default_instance__01945120);
    local_90._M_head_impl._0_4_ = (float)(int)pMVar7[1]._internal_metadata_.ptr_;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)local_70,"0",
               "message.GetExtension(Traits::optional_import_message_extension).d()",
               (int *)&local_88,(int *)&local_90);
    if (local_70[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_88);
      if (local_68 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar8 = anon_var_dwarf_a22956 + 5;
      }
      else {
        pcVar8 = (local_68->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_90,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                 ,0xca7,pcVar8);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_90,(Message *)&local_88);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_90);
      if (local_88._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_88._M_head_impl + 8))();
      }
    }
    if (local_68 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_68,local_68);
    }
    local_88._M_head_impl = local_88._M_head_impl & 0xffffffff00000000;
    pMVar7 = protobuf::internal::ExtensionSet::GetMessage
                       (&(this->_impl_)._extensions_,
                        proto2_unittest::optional_public_import_message_extension,
                        (MessageLite *)PTR__PublicImportMessage_default_instance__01945178);
    local_90._M_head_impl._0_4_ = (float)(int)pMVar7[1]._internal_metadata_.ptr_;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)local_70,"0",
               "message.GetExtension(Traits::optional_public_import_message_extension) .e()",
               (int *)&local_88,(int *)&local_90);
    if (local_70[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_88);
      if (local_68 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar8 = anon_var_dwarf_a22956 + 5;
      }
      else {
        pcVar8 = (local_68->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_90,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                 ,0xcaa,pcVar8);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_90,(Message *)&local_88);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_90);
      if (local_88._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_88._M_head_impl + 8))();
      }
    }
    if (local_68 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_68,local_68);
    }
    local_88._M_head_impl = local_88._M_head_impl & 0xffffffff00000000;
    pMVar7 = protobuf::internal::ExtensionSet::GetMessage
                       (&(this->_impl_)._extensions_,
                        proto2_unittest::optional_lazy_message_extension,
                        (MessageLite *)PTR__TestAllTypes_NestedMessage_default_instance__01945188);
    local_90._M_head_impl._0_4_ = (float)(int)pMVar7[1]._internal_metadata_.ptr_;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)local_70,"0",
               "message.GetExtension(Traits::optional_lazy_message_extension).bb()",(int *)&local_88
               ,(int *)&local_90);
    if (local_70[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_88);
      if (local_68 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar8 = anon_var_dwarf_a22956 + 5;
      }
      else {
        pcVar8 = (local_68->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_90,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                 ,0xcac,pcVar8);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_90,(Message *)&local_88);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_90);
      if (local_88._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_88._M_head_impl + 8))();
      }
    }
    if (local_68 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_68,local_68);
    }
    local_88._M_head_impl = local_88._M_head_impl & 0xffffffff00000000;
    pMVar7 = protobuf::internal::ExtensionSet::GetMessage
                       (&(this->_impl_)._extensions_,
                        proto2_unittest::optional_unverified_lazy_message_extension,
                        (MessageLite *)PTR__TestAllTypes_NestedMessage_default_instance__01945198);
    local_90._M_head_impl._0_4_ = (float)(int)pMVar7[1]._internal_metadata_.ptr_;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)local_70,"0",
               "message.GetExtension(Traits::optional_unverified_lazy_message_extension) .bb()",
               (int *)&local_88,(int *)&local_90);
    if (local_70[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_88);
      if (local_68 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar8 = anon_var_dwarf_a22956 + 5;
      }
      else {
        pcVar8 = (local_68->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_90,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                 ,0xcb0,pcVar8);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_90,(Message *)&local_88);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_90);
      if (local_88._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_88._M_head_impl + 8))();
      }
    }
    if (local_68 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_68,local_68);
    }
    iVar5 = protobuf::internal::ExtensionSet::GetEnum
                      (&(this->_impl_)._extensions_,proto2_unittest::optional_nested_enum_extension,
                       DAT_0194512c);
    local_88._M_head_impl._0_4_ = iVar5;
    testing::internal::
    CmpHelperEQ<proto2_unittest::TestAllTypes_NestedEnum,proto2_unittest::TestAllTypes_NestedEnum>
              ((internal *)local_70,"Traits::TestAllTypes::FOO",
               "message.GetExtension(Traits::optional_nested_enum_extension)",
               &proto2_unittest::TestAllTypes::FOO,(TestAllTypes_NestedEnum *)&local_88);
    if (local_70[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_88);
      if (local_68 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar8 = anon_var_dwarf_a22956 + 5;
      }
      else {
        pcVar8 = (local_68->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_90,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                 ,0xcb4,pcVar8);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_90,(Message *)&local_88);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_90);
      if (local_88._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_88._M_head_impl + 8))();
      }
    }
    if (local_68 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_68,local_68);
    }
    iVar5 = protobuf::internal::ExtensionSet::GetEnum
                      (&(this->_impl_)._extensions_,proto2_unittest::optional_foreign_enum_extension
                       ,DAT_01945134);
    local_88._M_head_impl._0_4_ = iVar5;
    testing::internal::CmpHelperEQ<proto2_unittest::ForeignEnum,proto2_unittest::ForeignEnum>
              ((internal *)local_70,"Traits::FOREIGN_FOO",
               "message.GetExtension(Traits::optional_foreign_enum_extension)",
               &TestUtilTraits<proto2_unittest::TestAllExtensions>::FOREIGN_FOO,
               (ForeignEnum *)&local_88);
    if (local_70[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_88);
      if (local_68 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar8 = anon_var_dwarf_a22956 + 5;
      }
      else {
        pcVar8 = (local_68->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_90,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                 ,0xcb6,pcVar8);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_90,(Message *)&local_88);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_90);
      if (local_88._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_88._M_head_impl + 8))();
      }
    }
    if (local_68 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_68,local_68);
    }
    iVar5 = protobuf::internal::ExtensionSet::GetEnum
                      (&(this->_impl_)._extensions_,proto2_unittest::optional_import_enum_extension,
                       DAT_0194513c);
    local_88._M_head_impl._0_4_ = iVar5;
    testing::internal::
    CmpHelperEQ<proto2_unittest_import::ImportEnum,proto2_unittest_import::ImportEnum>
              ((internal *)local_70,"Traits::IMPORT_FOO",
               "message.GetExtension(Traits::optional_import_enum_extension)",
               &TestUtilTraits<proto2_unittest::TestAllExtensions>::IMPORT_FOO,
               (ImportEnum *)&local_88);
    if (local_70[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_88);
      if (local_68 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar8 = anon_var_dwarf_a22956 + 5;
      }
      else {
        pcVar8 = (local_68->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_90,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                 ,0xcb8,pcVar8);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_90,(Message *)&local_88);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_90);
      if (local_88._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_88._M_head_impl + 8))();
      }
    }
    if (local_68 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_68,local_68);
    }
    psVar6 = protobuf::internal::ExtensionSet::GetString
                       (&(this->_impl_)._extensions_,
                        proto2_unittest::optional_string_piece_extension,
                        (string *)PTR_optional_string_piece_extension_default_abi_cxx11__01945148);
    pcVar8 = anon_var_dwarf_a22956 + 5;
    testing::internal::CmpHelperEQ<char[1],std::__cxx11::string>
              ((internal *)local_70,"\"\"",
               "message.GetExtension(Traits::optional_string_piece_extension)",
               (char (*) [1])(anon_var_dwarf_a22956 + 5),psVar6);
    if (local_70[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_88);
      if (local_68 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar8 = (local_68->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_90,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                 ,0xcba,pcVar8);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_90,(Message *)&local_88);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_90);
      if (local_88._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_88._M_head_impl + 8))();
      }
    }
    if (local_68 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_68,local_68);
    }
    psVar6 = protobuf::internal::ExtensionSet::GetString
                       (&(this->_impl_)._extensions_,proto2_unittest::optional_cord_extension,
                        (string *)PTR_optional_cord_extension_default_abi_cxx11__01945158);
    pcVar8 = anon_var_dwarf_a22956 + 5;
    testing::internal::CmpHelperEQ<char[1],std::__cxx11::string>
              ((internal *)local_70,"\"\"","message.GetExtension(Traits::optional_cord_extension)",
               (char (*) [1])(anon_var_dwarf_a22956 + 5),psVar6);
    if (local_70[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_88);
      if (local_68 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar8 = (local_68->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_90,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                 ,0xcbb,pcVar8);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_90,(Message *)&local_88);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_90);
      if (local_88._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_88._M_head_impl + 8))();
      }
    }
    if (local_68 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_68,local_68);
    }
    psVar6 = protobuf::internal::ExtensionSet::GetString
                       (&(this->_impl_)._extensions_,proto2_unittest::optional_bytes_cord_extension,
                        (string *)PTR_optional_bytes_cord_extension_default_abi_cxx11__01945168);
    pcVar8 = anon_var_dwarf_a22956 + 5;
    testing::internal::CmpHelperEQ<char[1],std::__cxx11::string>
              ((internal *)local_70,"\"\"",
               "message.GetExtension(Traits::optional_bytes_cord_extension)",
               (char (*) [1])(anon_var_dwarf_a22956 + 5),psVar6);
    if (local_70[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_88);
      if (local_68 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar8 = (local_68->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_90,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                 ,0xcbc,pcVar8);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_90,(Message *)&local_88);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_90);
      if (local_88._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_88._M_head_impl + 8))();
      }
    }
    if (local_68 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_68,local_68);
    }
    local_88._M_head_impl = local_88._M_head_impl & 0xffffffff00000000;
    iVar5 = protobuf::internal::ExtensionSet::ExtensionSize
                      (&(this->_impl_)._extensions_,proto2_unittest::repeated_int32_extension);
    local_90._M_head_impl._0_4_ = (float)iVar5;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)local_70,"0","message.ExtensionSize(Traits::repeated_int32_extension)",
               (int *)&local_88,(int *)&local_90);
    if (local_70[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_88);
      if (local_68 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar8 = anon_var_dwarf_a22956 + 5;
      }
      else {
        pcVar8 = (local_68->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_90,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                 ,0xcbf,pcVar8);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_90,(Message *)&local_88);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_90);
      if (local_88._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_88._M_head_impl + 8))();
      }
    }
    if (local_68 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_68,local_68);
    }
    local_88._M_head_impl = local_88._M_head_impl & 0xffffffff00000000;
    iVar5 = protobuf::internal::ExtensionSet::ExtensionSize
                      (&(this->_impl_)._extensions_,proto2_unittest::repeated_int64_extension);
    local_90._M_head_impl._0_4_ = (float)iVar5;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)local_70,"0","message.ExtensionSize(Traits::repeated_int64_extension)",
               (int *)&local_88,(int *)&local_90);
    if (local_70[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_88);
      if (local_68 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar8 = anon_var_dwarf_a22956 + 5;
      }
      else {
        pcVar8 = (local_68->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_90,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                 ,0xcc0,pcVar8);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_90,(Message *)&local_88);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_90);
      if (local_88._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_88._M_head_impl + 8))();
      }
    }
    if (local_68 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_68,local_68);
    }
    local_88._M_head_impl = local_88._M_head_impl & 0xffffffff00000000;
    iVar5 = protobuf::internal::ExtensionSet::ExtensionSize
                      (&(this->_impl_)._extensions_,proto2_unittest::repeated_uint32_extension);
    local_90._M_head_impl._0_4_ = (float)iVar5;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)local_70,"0","message.ExtensionSize(Traits::repeated_uint32_extension)",
               (int *)&local_88,(int *)&local_90);
    if (local_70[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_88);
      if (local_68 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar8 = anon_var_dwarf_a22956 + 5;
      }
      else {
        pcVar8 = (local_68->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_90,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                 ,0xcc1,pcVar8);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_90,(Message *)&local_88);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_90);
      if (local_88._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_88._M_head_impl + 8))();
      }
    }
    if (local_68 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_68,local_68);
    }
    local_88._M_head_impl = local_88._M_head_impl & 0xffffffff00000000;
    iVar5 = protobuf::internal::ExtensionSet::ExtensionSize
                      (&(this->_impl_)._extensions_,proto2_unittest::repeated_uint64_extension);
    local_90._M_head_impl._0_4_ = (float)iVar5;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)local_70,"0","message.ExtensionSize(Traits::repeated_uint64_extension)",
               (int *)&local_88,(int *)&local_90);
    if (local_70[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_88);
      if (local_68 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar8 = anon_var_dwarf_a22956 + 5;
      }
      else {
        pcVar8 = (local_68->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_90,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                 ,0xcc2,pcVar8);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_90,(Message *)&local_88);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_90);
      if (local_88._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_88._M_head_impl + 8))();
      }
    }
    if (local_68 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_68,local_68);
    }
    local_88._M_head_impl = local_88._M_head_impl & 0xffffffff00000000;
    iVar5 = protobuf::internal::ExtensionSet::ExtensionSize
                      (&(this->_impl_)._extensions_,proto2_unittest::repeated_sint32_extension);
    local_90._M_head_impl._0_4_ = (float)iVar5;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)local_70,"0","message.ExtensionSize(Traits::repeated_sint32_extension)",
               (int *)&local_88,(int *)&local_90);
    if (local_70[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_88);
      if (local_68 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar8 = anon_var_dwarf_a22956 + 5;
      }
      else {
        pcVar8 = (local_68->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_90,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                 ,0xcc3,pcVar8);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_90,(Message *)&local_88);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_90);
      if (local_88._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_88._M_head_impl + 8))();
      }
    }
    if (local_68 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_68,local_68);
    }
    local_88._M_head_impl = local_88._M_head_impl & 0xffffffff00000000;
    iVar5 = protobuf::internal::ExtensionSet::ExtensionSize
                      (&(this->_impl_)._extensions_,proto2_unittest::repeated_sint64_extension);
    local_90._M_head_impl._0_4_ = (float)iVar5;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)local_70,"0","message.ExtensionSize(Traits::repeated_sint64_extension)",
               (int *)&local_88,(int *)&local_90);
    if (local_70[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_88);
      if (local_68 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar8 = anon_var_dwarf_a22956 + 5;
      }
      else {
        pcVar8 = (local_68->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_90,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                 ,0xcc4,pcVar8);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_90,(Message *)&local_88);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_90);
      if (local_88._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_88._M_head_impl + 8))();
      }
    }
    if (local_68 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_68,local_68);
    }
    local_88._M_head_impl = local_88._M_head_impl & 0xffffffff00000000;
    iVar5 = protobuf::internal::ExtensionSet::ExtensionSize
                      (&(this->_impl_)._extensions_,(int)proto2_unittest::repeated_fixed32_extension
                      );
    local_90._M_head_impl._0_4_ = (float)iVar5;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)local_70,"0","message.ExtensionSize(Traits::repeated_fixed32_extension)",
               (int *)&local_88,(int *)&local_90);
    if (local_70[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_88);
      if (local_68 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar8 = anon_var_dwarf_a22956 + 5;
      }
      else {
        pcVar8 = (local_68->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_90,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                 ,0xcc5,pcVar8);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_90,(Message *)&local_88);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_90);
      if (local_88._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_88._M_head_impl + 8))();
      }
    }
    if (local_68 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_68,local_68);
    }
    local_88._M_head_impl = local_88._M_head_impl & 0xffffffff00000000;
    iVar5 = protobuf::internal::ExtensionSet::ExtensionSize
                      (&(this->_impl_)._extensions_,proto2_unittest::repeated_fixed64_extension);
    local_90._M_head_impl._0_4_ = (float)iVar5;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)local_70,"0","message.ExtensionSize(Traits::repeated_fixed64_extension)",
               (int *)&local_88,(int *)&local_90);
    if (local_70[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_88);
      if (local_68 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar8 = anon_var_dwarf_a22956 + 5;
      }
      else {
        pcVar8 = (local_68->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_90,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                 ,0xcc6,pcVar8);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_90,(Message *)&local_88);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_90);
      if (local_88._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_88._M_head_impl + 8))();
      }
    }
    if (local_68 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_68,local_68);
    }
    local_88._M_head_impl = local_88._M_head_impl & 0xffffffff00000000;
    iVar5 = protobuf::internal::ExtensionSet::ExtensionSize
                      (&(this->_impl_)._extensions_,proto2_unittest::repeated_sfixed32_extension);
    local_90._M_head_impl._0_4_ = (float)iVar5;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)local_70,"0","message.ExtensionSize(Traits::repeated_sfixed32_extension)"
               ,(int *)&local_88,(int *)&local_90);
    if (local_70[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_88);
      if (local_68 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar8 = anon_var_dwarf_a22956 + 5;
      }
      else {
        pcVar8 = (local_68->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_90,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                 ,0xcc7,pcVar8);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_90,(Message *)&local_88);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_90);
      if (local_88._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_88._M_head_impl + 8))();
      }
    }
    if (local_68 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_68,local_68);
    }
    local_88._M_head_impl = local_88._M_head_impl & 0xffffffff00000000;
    iVar5 = protobuf::internal::ExtensionSet::ExtensionSize
                      (&(this->_impl_)._extensions_,proto2_unittest::repeated_sfixed64_extension);
    local_90._M_head_impl._0_4_ = (float)iVar5;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)local_70,"0","message.ExtensionSize(Traits::repeated_sfixed64_extension)"
               ,(int *)&local_88,(int *)&local_90);
    if (local_70[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_88);
      if (local_68 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar8 = anon_var_dwarf_a22956 + 5;
      }
      else {
        pcVar8 = (local_68->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_90,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                 ,0xcc8,pcVar8);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_90,(Message *)&local_88);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_90);
      if (local_88._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_88._M_head_impl + 8))();
      }
    }
    if (local_68 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_68,local_68);
    }
    local_88._M_head_impl = local_88._M_head_impl & 0xffffffff00000000;
    iVar5 = protobuf::internal::ExtensionSet::ExtensionSize
                      (&(this->_impl_)._extensions_,(int)proto2_unittest::repeated_float_extension);
    local_90._M_head_impl._0_4_ = (float)iVar5;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)local_70,"0","message.ExtensionSize(Traits::repeated_float_extension)",
               (int *)&local_88,(int *)&local_90);
    if (local_70[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_88);
      if (local_68 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar8 = anon_var_dwarf_a22956 + 5;
      }
      else {
        pcVar8 = (local_68->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_90,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                 ,0xcc9,pcVar8);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_90,(Message *)&local_88);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_90);
      if (local_88._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_88._M_head_impl + 8))();
      }
    }
    if (local_68 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_68,local_68);
    }
    local_88._M_head_impl = local_88._M_head_impl & 0xffffffff00000000;
    iVar5 = protobuf::internal::ExtensionSet::ExtensionSize
                      (&(this->_impl_)._extensions_,proto2_unittest::repeated_double_extension);
    local_90._M_head_impl._0_4_ = (float)iVar5;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)local_70,"0","message.ExtensionSize(Traits::repeated_double_extension)",
               (int *)&local_88,(int *)&local_90);
    if (local_70[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_88);
      if (local_68 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar8 = anon_var_dwarf_a22956 + 5;
      }
      else {
        pcVar8 = (local_68->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_90,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                 ,0xcca,pcVar8);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_90,(Message *)&local_88);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_90);
      if (local_88._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_88._M_head_impl + 8))();
      }
    }
    if (local_68 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_68,local_68);
    }
    local_88._M_head_impl = local_88._M_head_impl & 0xffffffff00000000;
    iVar5 = protobuf::internal::ExtensionSet::ExtensionSize
                      (&(this->_impl_)._extensions_,proto2_unittest::repeated_bool_extension);
    local_90._M_head_impl._0_4_ = (float)iVar5;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)local_70,"0","message.ExtensionSize(Traits::repeated_bool_extension)",
               (int *)&local_88,(int *)&local_90);
    if (local_70[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_88);
      if (local_68 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar8 = anon_var_dwarf_a22956 + 5;
      }
      else {
        pcVar8 = (local_68->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_90,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                 ,0xccb,pcVar8);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_90,(Message *)&local_88);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_90);
      if (local_88._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_88._M_head_impl + 8))();
      }
    }
    if (local_68 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_68,local_68);
    }
    local_88._M_head_impl = local_88._M_head_impl & 0xffffffff00000000;
    iVar5 = protobuf::internal::ExtensionSet::ExtensionSize
                      (&(this->_impl_)._extensions_,proto2_unittest::repeated_string_extension);
    local_90._M_head_impl._0_4_ = (float)iVar5;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)local_70,"0","message.ExtensionSize(Traits::repeated_string_extension)",
               (int *)&local_88,(int *)&local_90);
    if (local_70[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_88);
      if (local_68 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar8 = anon_var_dwarf_a22956 + 5;
      }
      else {
        pcVar8 = (local_68->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_90,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                 ,0xccc,pcVar8);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_90,(Message *)&local_88);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_90);
      if (local_88._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_88._M_head_impl + 8))();
      }
    }
    if (local_68 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_68,local_68);
    }
    local_88._M_head_impl = local_88._M_head_impl & 0xffffffff00000000;
    iVar5 = protobuf::internal::ExtensionSet::ExtensionSize
                      (&(this->_impl_)._extensions_,proto2_unittest::repeated_bytes_extension);
    local_90._M_head_impl._0_4_ = (float)iVar5;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)local_70,"0","message.ExtensionSize(Traits::repeated_bytes_extension)",
               (int *)&local_88,(int *)&local_90);
    if (local_70[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_88);
      if (local_68 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar8 = anon_var_dwarf_a22956 + 5;
      }
      else {
        pcVar8 = (local_68->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_90,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                 ,0xccd,pcVar8);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_90,(Message *)&local_88);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_90);
      if (local_88._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_88._M_head_impl + 8))();
      }
    }
    if (local_68 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_68,local_68);
    }
    local_88._M_head_impl = local_88._M_head_impl & 0xffffffff00000000;
    iVar5 = protobuf::internal::ExtensionSet::ExtensionSize
                      (&(this->_impl_)._extensions_,proto2_unittest::repeatedgroup_extension);
    local_90._M_head_impl._0_4_ = (float)iVar5;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)local_70,"0","message.ExtensionSize(Traits::repeatedgroup_extension)",
               (int *)&local_88,(int *)&local_90);
    if (local_70[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_88);
      if (local_68 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar8 = anon_var_dwarf_a22956 + 5;
      }
      else {
        pcVar8 = (local_68->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_90,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                 ,0xccf,pcVar8);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_90,(Message *)&local_88);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_90);
      if (local_88._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_88._M_head_impl + 8))();
      }
    }
    if (local_68 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_68,local_68);
    }
    local_88._M_head_impl = local_88._M_head_impl & 0xffffffff00000000;
    iVar5 = protobuf::internal::ExtensionSet::ExtensionSize
                      (&(this->_impl_)._extensions_,
                       proto2_unittest::repeated_nested_message_extension);
    local_90._M_head_impl._0_4_ = (float)iVar5;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)local_70,"0",
               "message.ExtensionSize(Traits::repeated_nested_message_extension)",(int *)&local_88,
               (int *)&local_90);
    if (local_70[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_88);
      if (local_68 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar8 = anon_var_dwarf_a22956 + 5;
      }
      else {
        pcVar8 = (local_68->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_90,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                 ,0xcd1,pcVar8);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_90,(Message *)&local_88);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_90);
      if (local_88._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_88._M_head_impl + 8))();
      }
    }
    if (local_68 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_68,local_68);
    }
    local_88._M_head_impl = local_88._M_head_impl & 0xffffffff00000000;
    iVar5 = protobuf::internal::ExtensionSet::ExtensionSize
                      (&(this->_impl_)._extensions_,
                       proto2_unittest::repeated_foreign_message_extension);
    local_90._M_head_impl._0_4_ = (float)iVar5;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)local_70,"0",
               "message.ExtensionSize(Traits::repeated_foreign_message_extension)",(int *)&local_88,
               (int *)&local_90);
    if (local_70[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_88);
      if (local_68 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar8 = anon_var_dwarf_a22956 + 5;
      }
      else {
        pcVar8 = (local_68->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_90,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                 ,0xcd3,pcVar8);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_90,(Message *)&local_88);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_90);
      if (local_88._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_88._M_head_impl + 8))();
      }
    }
    if (local_68 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_68,local_68);
    }
    local_88._M_head_impl = local_88._M_head_impl & 0xffffffff00000000;
    iVar5 = protobuf::internal::ExtensionSet::ExtensionSize
                      (&(this->_impl_)._extensions_,
                       proto2_unittest::repeated_import_message_extension);
    local_90._M_head_impl._0_4_ = (float)iVar5;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)local_70,"0",
               "message.ExtensionSize(Traits::repeated_import_message_extension)",(int *)&local_88,
               (int *)&local_90);
    if (local_70[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_88);
      if (local_68 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar8 = anon_var_dwarf_a22956 + 5;
      }
      else {
        pcVar8 = (local_68->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_90,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                 ,0xcd5,pcVar8);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_90,(Message *)&local_88);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_90);
      if (local_88._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_88._M_head_impl + 8))();
      }
    }
    if (local_68 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_68,local_68);
    }
    local_88._M_head_impl = local_88._M_head_impl & 0xffffffff00000000;
    iVar5 = protobuf::internal::ExtensionSet::ExtensionSize
                      (&(this->_impl_)._extensions_,proto2_unittest::repeated_lazy_message_extension
                      );
    local_90._M_head_impl._0_4_ = (float)iVar5;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)local_70,"0",
               "message.ExtensionSize(Traits::repeated_lazy_message_extension)",(int *)&local_88,
               (int *)&local_90);
    if (local_70[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_88);
      if (local_68 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar8 = anon_var_dwarf_a22956 + 5;
      }
      else {
        pcVar8 = (local_68->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_90,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                 ,0xcd6,pcVar8);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_90,(Message *)&local_88);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_90);
      if (local_88._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_88._M_head_impl + 8))();
      }
    }
    if (local_68 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_68,local_68);
    }
    local_88._M_head_impl = local_88._M_head_impl & 0xffffffff00000000;
    iVar5 = protobuf::internal::ExtensionSet::ExtensionSize
                      (&(this->_impl_)._extensions_,proto2_unittest::repeated_nested_enum_extension)
    ;
    local_90._M_head_impl._0_4_ = (float)iVar5;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)local_70,"0",
               "message.ExtensionSize(Traits::repeated_nested_enum_extension)",(int *)&local_88,
               (int *)&local_90);
    if (local_70[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_88);
      if (local_68 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar8 = anon_var_dwarf_a22956 + 5;
      }
      else {
        pcVar8 = (local_68->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_90,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                 ,0xcd7,pcVar8);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_90,(Message *)&local_88);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_90);
      if (local_88._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_88._M_head_impl + 8))();
      }
    }
    if (local_68 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_68,local_68);
    }
    local_88._M_head_impl = local_88._M_head_impl & 0xffffffff00000000;
    iVar5 = protobuf::internal::ExtensionSet::ExtensionSize
                      (&(this->_impl_)._extensions_,proto2_unittest::repeated_foreign_enum_extension
                      );
    local_90._M_head_impl._0_4_ = (float)iVar5;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)local_70,"0",
               "message.ExtensionSize(Traits::repeated_foreign_enum_extension)",(int *)&local_88,
               (int *)&local_90);
    if (local_70[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_88);
      if (local_68 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar8 = anon_var_dwarf_a22956 + 5;
      }
      else {
        pcVar8 = (local_68->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_90,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                 ,0xcd8,pcVar8);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_90,(Message *)&local_88);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_90);
      if (local_88._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_88._M_head_impl + 8))();
      }
    }
    if (local_68 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_68,local_68);
    }
    local_88._M_head_impl = local_88._M_head_impl & 0xffffffff00000000;
    iVar5 = protobuf::internal::ExtensionSet::ExtensionSize
                      (&(this->_impl_)._extensions_,proto2_unittest::repeated_import_enum_extension)
    ;
    local_90._M_head_impl._0_4_ = (float)iVar5;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)local_70,"0",
               "message.ExtensionSize(Traits::repeated_import_enum_extension)",(int *)&local_88,
               (int *)&local_90);
    if (local_70[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_88);
      if (local_68 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar8 = anon_var_dwarf_a22956 + 5;
      }
      else {
        pcVar8 = (local_68->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_90,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                 ,0xcd9,pcVar8);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_90,(Message *)&local_88);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_90);
      if (local_88._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_88._M_head_impl + 8))();
      }
    }
    if (local_68 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_68,local_68);
    }
    local_88._M_head_impl = local_88._M_head_impl & 0xffffffff00000000;
    iVar5 = protobuf::internal::ExtensionSet::ExtensionSize
                      (&(this->_impl_)._extensions_,proto2_unittest::repeated_string_piece_extension
                      );
    local_90._M_head_impl._0_4_ = (float)iVar5;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)local_70,"0",
               "message.ExtensionSize(Traits::repeated_string_piece_extension)",(int *)&local_88,
               (int *)&local_90);
    if (local_70[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_88);
      if (local_68 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar8 = anon_var_dwarf_a22956 + 5;
      }
      else {
        pcVar8 = (local_68->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_90,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                 ,0xcdb,pcVar8);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_90,(Message *)&local_88);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_90);
      if (local_88._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_88._M_head_impl + 8))();
      }
    }
    if (local_68 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_68,local_68);
    }
    local_88._M_head_impl = local_88._M_head_impl & 0xffffffff00000000;
    iVar5 = protobuf::internal::ExtensionSet::ExtensionSize
                      (&(this->_impl_)._extensions_,proto2_unittest::repeated_cord_extension);
    local_90._M_head_impl._0_4_ = (float)iVar5;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)local_70,"0","message.ExtensionSize(Traits::repeated_cord_extension)",
               (int *)&local_88,(int *)&local_90);
    if (local_70[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_88);
      if (local_68 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar8 = anon_var_dwarf_a22956 + 5;
      }
      else {
        pcVar8 = (local_68->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_90,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                 ,0xcdc,pcVar8);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_90,(Message *)&local_88);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_90);
      if (local_88._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_88._M_head_impl + 8))();
      }
    }
    if (local_68 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_68,local_68);
    }
    bVar1 = protobuf::internal::ExtensionSet::Has
                      (&(this->_impl_)._extensions_,proto2_unittest::default_int32_extension);
    local_80 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_88._M_head_impl._0_1_ = (internal)!bVar1;
    if (bVar1) {
      testing::Message::Message((Message *)&local_90);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_70,(internal *)&local_88,
                 (AssertionResult *)"message.HasExtension(Traits::default_int32_extension)","true",
                 "false",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_78,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                 ,0xcdf,(char *)CONCAT71(local_70._1_7_,local_70[0]));
      testing::internal::AssertHelper::operator=(&local_78,(Message *)&local_90);
      testing::internal::AssertHelper::~AssertHelper(&local_78);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_70._1_7_,local_70[0]) != &local_60) {
        operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT71(local_70._1_7_,local_70[0]),local_60._M_allocated_capacity + 1);
      }
      if (local_90._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_90._M_head_impl + 8))();
      }
      if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_80,local_80);
      }
    }
    bVar1 = protobuf::internal::ExtensionSet::Has
                      (&(this->_impl_)._extensions_,proto2_unittest::default_int64_extension);
    local_88._M_head_impl._0_1_ = (internal)!bVar1;
    local_80 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (bVar1) {
      testing::Message::Message((Message *)&local_90);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_70,(internal *)&local_88,
                 (AssertionResult *)"message.HasExtension(Traits::default_int64_extension)","true",
                 "false",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_78,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                 ,0xce0,(char *)CONCAT71(local_70._1_7_,local_70[0]));
      testing::internal::AssertHelper::operator=(&local_78,(Message *)&local_90);
      testing::internal::AssertHelper::~AssertHelper(&local_78);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_70._1_7_,local_70[0]) != &local_60) {
        operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT71(local_70._1_7_,local_70[0]),local_60._M_allocated_capacity + 1);
      }
      if (local_90._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_90._M_head_impl + 8))();
      }
      if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_80,local_80);
      }
    }
    bVar1 = protobuf::internal::ExtensionSet::Has
                      (&(this->_impl_)._extensions_,proto2_unittest::default_uint32_extension);
    local_88._M_head_impl._0_1_ = (internal)!bVar1;
    local_80 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (bVar1) {
      testing::Message::Message((Message *)&local_90);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_70,(internal *)&local_88,
                 (AssertionResult *)"message.HasExtension(Traits::default_uint32_extension)","true",
                 "false",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_78,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                 ,0xce1,(char *)CONCAT71(local_70._1_7_,local_70[0]));
      testing::internal::AssertHelper::operator=(&local_78,(Message *)&local_90);
      testing::internal::AssertHelper::~AssertHelper(&local_78);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_70._1_7_,local_70[0]) != &local_60) {
        operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT71(local_70._1_7_,local_70[0]),local_60._M_allocated_capacity + 1);
      }
      if (local_90._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_90._M_head_impl + 8))();
      }
      if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_80,local_80);
      }
    }
    bVar1 = protobuf::internal::ExtensionSet::Has
                      (&(this->_impl_)._extensions_,proto2_unittest::default_uint64_extension);
    local_88._M_head_impl._0_1_ = (internal)!bVar1;
    local_80 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (bVar1) {
      testing::Message::Message((Message *)&local_90);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_70,(internal *)&local_88,
                 (AssertionResult *)"message.HasExtension(Traits::default_uint64_extension)","true",
                 "false",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_78,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                 ,0xce2,(char *)CONCAT71(local_70._1_7_,local_70[0]));
      testing::internal::AssertHelper::operator=(&local_78,(Message *)&local_90);
      testing::internal::AssertHelper::~AssertHelper(&local_78);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_70._1_7_,local_70[0]) != &local_60) {
        operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT71(local_70._1_7_,local_70[0]),local_60._M_allocated_capacity + 1);
      }
      if (local_90._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_90._M_head_impl + 8))();
      }
      if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_80,local_80);
      }
    }
    bVar1 = protobuf::internal::ExtensionSet::Has
                      (&(this->_impl_)._extensions_,proto2_unittest::default_sint32_extension);
    local_88._M_head_impl._0_1_ = (internal)!bVar1;
    local_80 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (bVar1) {
      testing::Message::Message((Message *)&local_90);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_70,(internal *)&local_88,
                 (AssertionResult *)"message.HasExtension(Traits::default_sint32_extension)","true",
                 "false",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_78,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                 ,0xce3,(char *)CONCAT71(local_70._1_7_,local_70[0]));
      testing::internal::AssertHelper::operator=(&local_78,(Message *)&local_90);
      testing::internal::AssertHelper::~AssertHelper(&local_78);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_70._1_7_,local_70[0]) != &local_60) {
        operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT71(local_70._1_7_,local_70[0]),local_60._M_allocated_capacity + 1);
      }
      if (local_90._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_90._M_head_impl + 8))();
      }
      if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_80,local_80);
      }
    }
    bVar1 = protobuf::internal::ExtensionSet::Has
                      (&(this->_impl_)._extensions_,proto2_unittest::default_sint64_extension);
    local_88._M_head_impl._0_1_ = (internal)!bVar1;
    local_80 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (bVar1) {
      testing::Message::Message((Message *)&local_90);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_70,(internal *)&local_88,
                 (AssertionResult *)"message.HasExtension(Traits::default_sint64_extension)","true",
                 "false",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_78,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                 ,0xce4,(char *)CONCAT71(local_70._1_7_,local_70[0]));
      testing::internal::AssertHelper::operator=(&local_78,(Message *)&local_90);
      testing::internal::AssertHelper::~AssertHelper(&local_78);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_70._1_7_,local_70[0]) != &local_60) {
        operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT71(local_70._1_7_,local_70[0]),local_60._M_allocated_capacity + 1);
      }
      if (local_90._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_90._M_head_impl + 8))();
      }
      if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_80,local_80);
      }
    }
    bVar1 = protobuf::internal::ExtensionSet::Has
                      (&(this->_impl_)._extensions_,proto2_unittest::default_fixed32_extension);
    local_88._M_head_impl._0_1_ = (internal)!bVar1;
    local_80 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (bVar1) {
      testing::Message::Message((Message *)&local_90);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_70,(internal *)&local_88,
                 (AssertionResult *)"message.HasExtension(Traits::default_fixed32_extension)","true"
                 ,"false",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_78,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                 ,0xce5,(char *)CONCAT71(local_70._1_7_,local_70[0]));
      testing::internal::AssertHelper::operator=(&local_78,(Message *)&local_90);
      testing::internal::AssertHelper::~AssertHelper(&local_78);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_70._1_7_,local_70[0]) != &local_60) {
        operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT71(local_70._1_7_,local_70[0]),local_60._M_allocated_capacity + 1);
      }
      if (local_90._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_90._M_head_impl + 8))();
      }
      if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_80,local_80);
      }
    }
    bVar1 = protobuf::internal::ExtensionSet::Has
                      (&(this->_impl_)._extensions_,proto2_unittest::default_fixed64_extension);
    local_88._M_head_impl._0_1_ = (internal)!bVar1;
    local_80 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (bVar1) {
      testing::Message::Message((Message *)&local_90);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_70,(internal *)&local_88,
                 (AssertionResult *)"message.HasExtension(Traits::default_fixed64_extension)","true"
                 ,"false",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_78,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                 ,0xce6,(char *)CONCAT71(local_70._1_7_,local_70[0]));
      testing::internal::AssertHelper::operator=(&local_78,(Message *)&local_90);
      testing::internal::AssertHelper::~AssertHelper(&local_78);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_70._1_7_,local_70[0]) != &local_60) {
        operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT71(local_70._1_7_,local_70[0]),local_60._M_allocated_capacity + 1);
      }
      if (local_90._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_90._M_head_impl + 8))();
      }
      if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_80,local_80);
      }
    }
    bVar1 = protobuf::internal::ExtensionSet::Has
                      (&(this->_impl_)._extensions_,proto2_unittest::default_sfixed32_extension);
    local_88._M_head_impl._0_1_ = (internal)!bVar1;
    local_80 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (bVar1) {
      testing::Message::Message((Message *)&local_90);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_70,(internal *)&local_88,
                 (AssertionResult *)"message.HasExtension(Traits::default_sfixed32_extension)",
                 "true","false",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_78,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                 ,0xce7,(char *)CONCAT71(local_70._1_7_,local_70[0]));
      testing::internal::AssertHelper::operator=(&local_78,(Message *)&local_90);
      testing::internal::AssertHelper::~AssertHelper(&local_78);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_70._1_7_,local_70[0]) != &local_60) {
        operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT71(local_70._1_7_,local_70[0]),local_60._M_allocated_capacity + 1);
      }
      if (local_90._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_90._M_head_impl + 8))();
      }
      if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_80,local_80);
      }
    }
    bVar1 = protobuf::internal::ExtensionSet::Has
                      (&(this->_impl_)._extensions_,proto2_unittest::default_sfixed64_extension);
    local_88._M_head_impl._0_1_ = (internal)!bVar1;
    local_80 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (bVar1) {
      testing::Message::Message((Message *)&local_90);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_70,(internal *)&local_88,
                 (AssertionResult *)"message.HasExtension(Traits::default_sfixed64_extension)",
                 "true","false",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_78,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                 ,0xce8,(char *)CONCAT71(local_70._1_7_,local_70[0]));
      testing::internal::AssertHelper::operator=(&local_78,(Message *)&local_90);
      testing::internal::AssertHelper::~AssertHelper(&local_78);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_70._1_7_,local_70[0]) != &local_60) {
        operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT71(local_70._1_7_,local_70[0]),local_60._M_allocated_capacity + 1);
      }
      if (local_90._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_90._M_head_impl + 8))();
      }
      if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_80,local_80);
      }
    }
    bVar1 = protobuf::internal::ExtensionSet::Has
                      (&(this->_impl_)._extensions_,proto2_unittest::default_float_extension);
    local_88._M_head_impl._0_1_ = (internal)!bVar1;
    local_80 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (bVar1) {
      testing::Message::Message((Message *)&local_90);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_70,(internal *)&local_88,
                 (AssertionResult *)"message.HasExtension(Traits::default_float_extension)","true",
                 "false",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_78,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                 ,0xce9,(char *)CONCAT71(local_70._1_7_,local_70[0]));
      testing::internal::AssertHelper::operator=(&local_78,(Message *)&local_90);
      testing::internal::AssertHelper::~AssertHelper(&local_78);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_70._1_7_,local_70[0]) != &local_60) {
        operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT71(local_70._1_7_,local_70[0]),local_60._M_allocated_capacity + 1);
      }
      if (local_90._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_90._M_head_impl + 8))();
      }
      if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_80,local_80);
      }
    }
    bVar1 = protobuf::internal::ExtensionSet::Has
                      (&(this->_impl_)._extensions_,proto2_unittest::default_double_extension);
    local_88._M_head_impl._0_1_ = (internal)!bVar1;
    local_80 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (bVar1) {
      testing::Message::Message((Message *)&local_90);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_70,(internal *)&local_88,
                 (AssertionResult *)"message.HasExtension(Traits::default_double_extension)","true",
                 "false",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_78,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                 ,0xcea,(char *)CONCAT71(local_70._1_7_,local_70[0]));
      testing::internal::AssertHelper::operator=(&local_78,(Message *)&local_90);
      testing::internal::AssertHelper::~AssertHelper(&local_78);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_70._1_7_,local_70[0]) != &local_60) {
        operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT71(local_70._1_7_,local_70[0]),local_60._M_allocated_capacity + 1);
      }
      if (local_90._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_90._M_head_impl + 8))();
      }
      if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_80,local_80);
      }
    }
    bVar1 = protobuf::internal::ExtensionSet::Has
                      (&(this->_impl_)._extensions_,proto2_unittest::default_bool_extension);
    local_88._M_head_impl._0_1_ = (internal)!bVar1;
    local_80 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (bVar1) {
      testing::Message::Message((Message *)&local_90);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_70,(internal *)&local_88,
                 (AssertionResult *)"message.HasExtension(Traits::default_bool_extension)","true",
                 "false",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_78,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                 ,0xceb,(char *)CONCAT71(local_70._1_7_,local_70[0]));
      testing::internal::AssertHelper::operator=(&local_78,(Message *)&local_90);
      testing::internal::AssertHelper::~AssertHelper(&local_78);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_70._1_7_,local_70[0]) != &local_60) {
        operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT71(local_70._1_7_,local_70[0]),local_60._M_allocated_capacity + 1);
      }
      if (local_90._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_90._M_head_impl + 8))();
      }
      if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_80,local_80);
      }
    }
    bVar1 = protobuf::internal::ExtensionSet::Has
                      (&(this->_impl_)._extensions_,proto2_unittest::default_string_extension);
    local_88._M_head_impl._0_1_ = (internal)!bVar1;
    local_80 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (bVar1) {
      testing::Message::Message((Message *)&local_90);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_70,(internal *)&local_88,
                 (AssertionResult *)"message.HasExtension(Traits::default_string_extension)","true",
                 "false",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_78,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                 ,0xcec,(char *)CONCAT71(local_70._1_7_,local_70[0]));
      testing::internal::AssertHelper::operator=(&local_78,(Message *)&local_90);
      testing::internal::AssertHelper::~AssertHelper(&local_78);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_70._1_7_,local_70[0]) != &local_60) {
        operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT71(local_70._1_7_,local_70[0]),local_60._M_allocated_capacity + 1);
      }
      if (local_90._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_90._M_head_impl + 8))();
      }
      if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_80,local_80);
      }
    }
    bVar1 = protobuf::internal::ExtensionSet::Has
                      (&(this->_impl_)._extensions_,proto2_unittest::default_bytes_extension);
    local_88._M_head_impl._0_1_ = (internal)!bVar1;
    local_80 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (bVar1) {
      testing::Message::Message((Message *)&local_90);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_70,(internal *)&local_88,
                 (AssertionResult *)"message.HasExtension(Traits::default_bytes_extension)","true",
                 "false",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_78,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                 ,0xced,(char *)CONCAT71(local_70._1_7_,local_70[0]));
      testing::internal::AssertHelper::operator=(&local_78,(Message *)&local_90);
      testing::internal::AssertHelper::~AssertHelper(&local_78);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_70._1_7_,local_70[0]) != &local_60) {
        operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT71(local_70._1_7_,local_70[0]),local_60._M_allocated_capacity + 1);
      }
      if (local_90._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_90._M_head_impl + 8))();
      }
      if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_80,local_80);
      }
    }
    bVar1 = protobuf::internal::ExtensionSet::Has
                      (&(this->_impl_)._extensions_,proto2_unittest::default_nested_enum_extension);
    local_88._M_head_impl._0_1_ = (internal)!bVar1;
    local_80 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (bVar1) {
      testing::Message::Message((Message *)&local_90);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_70,(internal *)&local_88,
                 (AssertionResult *)"message.HasExtension(Traits::default_nested_enum_extension)",
                 "true","false",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_78,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                 ,0xcef,(char *)CONCAT71(local_70._1_7_,local_70[0]));
      testing::internal::AssertHelper::operator=(&local_78,(Message *)&local_90);
      testing::internal::AssertHelper::~AssertHelper(&local_78);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_70._1_7_,local_70[0]) != &local_60) {
        operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT71(local_70._1_7_,local_70[0]),local_60._M_allocated_capacity + 1);
      }
      if (local_90._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_90._M_head_impl + 8))();
      }
      if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_80,local_80);
      }
    }
    bVar1 = protobuf::internal::ExtensionSet::Has
                      (&(this->_impl_)._extensions_,proto2_unittest::default_foreign_enum_extension)
    ;
    local_88._M_head_impl._0_1_ = (internal)!bVar1;
    local_80 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (bVar1) {
      testing::Message::Message((Message *)&local_90);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_70,(internal *)&local_88,
                 (AssertionResult *)"message.HasExtension(Traits::default_foreign_enum_extension)",
                 "true","false",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_78,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                 ,0xcf0,(char *)CONCAT71(local_70._1_7_,local_70[0]));
      testing::internal::AssertHelper::operator=(&local_78,(Message *)&local_90);
      testing::internal::AssertHelper::~AssertHelper(&local_78);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_70._1_7_,local_70[0]) != &local_60) {
        operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT71(local_70._1_7_,local_70[0]),local_60._M_allocated_capacity + 1);
      }
      if (local_90._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_90._M_head_impl + 8))();
      }
      if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_80,local_80);
      }
    }
    bVar1 = protobuf::internal::ExtensionSet::Has
                      (&(this->_impl_)._extensions_,proto2_unittest::default_import_enum_extension);
    local_88._M_head_impl._0_1_ = (internal)!bVar1;
    local_80 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (bVar1) {
      testing::Message::Message((Message *)&local_90);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_70,(internal *)&local_88,
                 (AssertionResult *)"message.HasExtension(Traits::default_import_enum_extension)",
                 "true","false",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_78,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                 ,0xcf1,(char *)CONCAT71(local_70._1_7_,local_70[0]));
      testing::internal::AssertHelper::operator=(&local_78,(Message *)&local_90);
      testing::internal::AssertHelper::~AssertHelper(&local_78);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_70._1_7_,local_70[0]) != &local_60) {
        operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT71(local_70._1_7_,local_70[0]),local_60._M_allocated_capacity + 1);
      }
      if (local_90._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_90._M_head_impl + 8))();
      }
      if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_80,local_80);
      }
    }
    bVar1 = protobuf::internal::ExtensionSet::Has
                      (&(this->_impl_)._extensions_,proto2_unittest::default_string_piece_extension)
    ;
    local_88._M_head_impl._0_1_ = (internal)!bVar1;
    local_80 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (bVar1) {
      testing::Message::Message((Message *)&local_90);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_70,(internal *)&local_88,
                 (AssertionResult *)"message.HasExtension(Traits::default_string_piece_extension)",
                 "true","false",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_78,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                 ,0xcf3,(char *)CONCAT71(local_70._1_7_,local_70[0]));
      testing::internal::AssertHelper::operator=(&local_78,(Message *)&local_90);
      testing::internal::AssertHelper::~AssertHelper(&local_78);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_70._1_7_,local_70[0]) != &local_60) {
        operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT71(local_70._1_7_,local_70[0]),local_60._M_allocated_capacity + 1);
      }
      if (local_90._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_90._M_head_impl + 8))();
      }
      if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_80,local_80);
      }
    }
    bVar1 = protobuf::internal::ExtensionSet::Has
                      (&(this->_impl_)._extensions_,proto2_unittest::default_cord_extension);
    local_88._M_head_impl._0_1_ = (internal)!bVar1;
    local_80 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (bVar1) {
      testing::Message::Message((Message *)&local_90);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_70,(internal *)&local_88,
                 (AssertionResult *)"message.HasExtension(Traits::default_cord_extension)","true",
                 "false",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_78,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                 ,0xcf4,(char *)CONCAT71(local_70._1_7_,local_70[0]));
      testing::internal::AssertHelper::operator=(&local_78,(Message *)&local_90);
      testing::internal::AssertHelper::~AssertHelper(&local_78);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_70._1_7_,local_70[0]) != &local_60) {
        operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT71(local_70._1_7_,local_70[0]),local_60._M_allocated_capacity + 1);
      }
      if (local_90._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_90._M_head_impl + 8))();
      }
      if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_80,local_80);
      }
    }
    local_88._M_head_impl._0_4_ = 0x29;
    iVar2 = protobuf::internal::ExtensionSet::GetInt32
                      (&(this->_impl_)._extensions_,proto2_unittest::default_int32_extension,
                       DAT_019452e4);
    local_90._M_head_impl._0_4_ = (float)iVar2;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)local_70,"41","message.GetExtension(Traits::default_int32_extension)",
               (int *)&local_88,(int *)&local_90);
    if (local_70[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_88);
      if (local_68 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar8 = anon_var_dwarf_a22956 + 5;
      }
      else {
        pcVar8 = (local_68->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_90,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                 ,0xcf7,pcVar8);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_90,(Message *)&local_88);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_90);
      if (local_88._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_88._M_head_impl + 8))();
      }
    }
    if (local_68 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_68,local_68);
    }
    local_90._M_head_impl._0_4_ = 5.88545e-44;
    local_88._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
         protobuf::internal::ExtensionSet::GetInt64
                   (&(this->_impl_)._extensions_,proto2_unittest::default_int64_extension,
                    DAT_019452f0);
    testing::internal::CmpHelperEQ<int,long>
              ((internal *)local_70,"42","message.GetExtension(Traits::default_int64_extension)",
               (int *)&local_90,(long *)&local_88);
    if (local_70[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_88);
      if (local_68 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar8 = anon_var_dwarf_a22956 + 5;
      }
      else {
        pcVar8 = (local_68->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_90,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                 ,0xcf8,pcVar8);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_90,(Message *)&local_88);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_90);
      if (local_88._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_88._M_head_impl + 8))();
      }
    }
    if (local_68 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_68,local_68);
    }
    local_88._M_head_impl._0_4_ = 0x2b;
    uVar3 = protobuf::internal::ExtensionSet::GetUInt32
                      (&(this->_impl_)._extensions_,proto2_unittest::default_uint32_extension,
                       DAT_019452fc);
    local_90._M_head_impl._0_4_ = (float)uVar3;
    testing::internal::CmpHelperEQ<int,unsigned_int>
              ((internal *)local_70,"43","message.GetExtension(Traits::default_uint32_extension)",
               (int *)&local_88,(uint *)&local_90);
    if (local_70[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_88);
      if (local_68 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar8 = anon_var_dwarf_a22956 + 5;
      }
      else {
        pcVar8 = (local_68->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_90,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                 ,0xcf9,pcVar8);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_90,(Message *)&local_88);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_90);
      if (local_88._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_88._M_head_impl + 8))();
      }
    }
    if (local_68 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_68,local_68);
    }
    local_90._M_head_impl._0_4_ = 6.16571e-44;
    local_88._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
         protobuf::internal::ExtensionSet::GetUInt64
                   (&(this->_impl_)._extensions_,proto2_unittest::default_uint64_extension,
                    DAT_01945308);
    testing::internal::CmpHelperEQ<int,unsigned_long>
              ((internal *)local_70,"44","message.GetExtension(Traits::default_uint64_extension)",
               (int *)&local_90,(unsigned_long *)&local_88);
    if (local_70[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_88);
      if (local_68 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar8 = anon_var_dwarf_a22956 + 5;
      }
      else {
        pcVar8 = (local_68->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_90,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                 ,0xcfa,pcVar8);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_90,(Message *)&local_88);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_90);
      if (local_88._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_88._M_head_impl + 8))();
      }
    }
    if (local_68 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_68,local_68);
    }
    local_88._M_head_impl._0_4_ = 0xffffffd3;
    iVar2 = protobuf::internal::ExtensionSet::GetInt32
                      (&(this->_impl_)._extensions_,proto2_unittest::default_sint32_extension,
                       DAT_01945314);
    local_90._M_head_impl._0_4_ = (float)iVar2;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)local_70,"-45","message.GetExtension(Traits::default_sint32_extension)",
               (int *)&local_88,(int *)&local_90);
    if (local_70[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_88);
      if (local_68 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar8 = anon_var_dwarf_a22956 + 5;
      }
      else {
        pcVar8 = (local_68->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_90,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                 ,0xcfb,pcVar8);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_90,(Message *)&local_88);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_90);
      if (local_88._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_88._M_head_impl + 8))();
      }
    }
    if (local_68 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_68,local_68);
    }
    local_90._M_head_impl._0_4_ = 6.44597e-44;
    local_88._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
         protobuf::internal::ExtensionSet::GetInt64
                   (&(this->_impl_)._extensions_,proto2_unittest::default_sint64_extension,
                    DAT_01945320);
    testing::internal::CmpHelperEQ<int,long>
              ((internal *)local_70,"46","message.GetExtension(Traits::default_sint64_extension)",
               (int *)&local_90,(long *)&local_88);
    if (local_70[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_88);
      if (local_68 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar8 = anon_var_dwarf_a22956 + 5;
      }
      else {
        pcVar8 = (local_68->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_90,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                 ,0xcfc,pcVar8);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_90,(Message *)&local_88);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_90);
      if (local_88._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_88._M_head_impl + 8))();
      }
    }
    if (local_68 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_68,local_68);
    }
    local_88._M_head_impl._0_4_ = 0x2f;
    uVar3 = protobuf::internal::ExtensionSet::GetUInt32
                      (&(this->_impl_)._extensions_,proto2_unittest::default_fixed32_extension,
                       DAT_0194532c);
    local_90._M_head_impl._0_4_ = (float)uVar3;
    testing::internal::CmpHelperEQ<int,unsigned_int>
              ((internal *)local_70,"47","message.GetExtension(Traits::default_fixed32_extension)",
               (int *)&local_88,(uint *)&local_90);
    if (local_70[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_88);
      if (local_68 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar8 = anon_var_dwarf_a22956 + 5;
      }
      else {
        pcVar8 = (local_68->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_90,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                 ,0xcfd,pcVar8);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_90,(Message *)&local_88);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_90);
      if (local_88._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_88._M_head_impl + 8))();
      }
    }
    if (local_68 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_68,local_68);
    }
    local_90._M_head_impl._0_4_ = 6.72623e-44;
    local_88._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
         protobuf::internal::ExtensionSet::GetUInt64
                   (&(this->_impl_)._extensions_,proto2_unittest::default_fixed64_extension,
                    DAT_01945338);
    testing::internal::CmpHelperEQ<int,unsigned_long>
              ((internal *)local_70,"48","message.GetExtension(Traits::default_fixed64_extension)",
               (int *)&local_90,(unsigned_long *)&local_88);
    if (local_70[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_88);
      if (local_68 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar8 = anon_var_dwarf_a22956 + 5;
      }
      else {
        pcVar8 = (local_68->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_90,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                 ,0xcfe,pcVar8);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_90,(Message *)&local_88);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_90);
      if (local_88._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_88._M_head_impl + 8))();
      }
    }
    if (local_68 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_68,local_68);
    }
    local_88._M_head_impl._0_4_ = 0x31;
    iVar2 = protobuf::internal::ExtensionSet::GetInt32
                      (&(this->_impl_)._extensions_,proto2_unittest::default_sfixed32_extension,
                       DAT_01945344);
    local_90._M_head_impl._0_4_ = (float)iVar2;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)local_70,"49","message.GetExtension(Traits::default_sfixed32_extension)",
               (int *)&local_88,(int *)&local_90);
    if (local_70[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_88);
      if (local_68 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar8 = anon_var_dwarf_a22956 + 5;
      }
      else {
        pcVar8 = (local_68->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_90,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                 ,0xcff,pcVar8);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_90,(Message *)&local_88);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_90);
      if (local_88._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_88._M_head_impl + 8))();
      }
    }
    if (local_68 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_68,local_68);
    }
    local_90._M_head_impl._0_4_ = -NAN;
    local_88._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
         protobuf::internal::ExtensionSet::GetInt64
                   (&(this->_impl_)._extensions_,proto2_unittest::default_sfixed64_extension,
                    DAT_01945350);
    testing::internal::CmpHelperEQ<int,long>
              ((internal *)local_70,"-50","message.GetExtension(Traits::default_sfixed64_extension)"
               ,(int *)&local_90,(long *)&local_88);
    if (local_70[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_88);
      if (local_68 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar8 = anon_var_dwarf_a22956 + 5;
      }
      else {
        pcVar8 = (local_68->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_90,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                 ,0xd00,pcVar8);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_90,(Message *)&local_88);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_90);
      if (local_88._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_88._M_head_impl + 8))();
      }
    }
    if (local_68 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_68,local_68);
    }
    local_88._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
         &DAT_4049c00000000000;
    fVar9 = protobuf::internal::ExtensionSet::GetFloat
                      (&(this->_impl_)._extensions_,proto2_unittest::default_float_extension,
                       DAT_0194535c);
    local_90._M_head_impl._0_4_ = fVar9;
    testing::internal::CmpHelperEQ<double,float>
              ((internal *)local_70,"51.5","message.GetExtension(Traits::default_float_extension)",
               (double *)&local_88,(float *)&local_90);
    if (local_70[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_88);
      if (local_68 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar8 = anon_var_dwarf_a22956 + 5;
      }
      else {
        pcVar8 = (local_68->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_90,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                 ,0xd01,pcVar8);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_90,(Message *)&local_88);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_90);
      if (local_88._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_88._M_head_impl + 8))();
      }
    }
    if (local_68 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_68,local_68);
    }
    local_88._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
         &DAT_40e9640000000000;
    local_90._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
         protobuf::internal::ExtensionSet::GetDouble
                   (&(this->_impl_)._extensions_,proto2_unittest::default_double_extension,
                    DAT_01945368);
    testing::internal::CmpHelperEQ<double,double>
              ((internal *)local_70,"52e3","message.GetExtension(Traits::default_double_extension)",
               (double *)&local_88,(double *)&local_90);
    if (local_70[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_88);
      if (local_68 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar8 = anon_var_dwarf_a22956 + 5;
      }
      else {
        pcVar8 = (local_68->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_90,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                 ,0xd02,pcVar8);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_90,(Message *)&local_88);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_90);
      if (local_88._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_88._M_head_impl + 8))();
      }
    }
    if (local_68 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_68,local_68);
    }
    bVar1 = protobuf::internal::ExtensionSet::GetBool
                      (&(this->_impl_)._extensions_,proto2_unittest::default_bool_extension,
                       (bool)DAT_01945374);
    local_88._M_head_impl._0_1_ = (internal)bVar1;
    local_80 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (!bVar1) {
      testing::Message::Message((Message *)&local_90);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_70,(internal *)&local_88,
                 (AssertionResult *)"message.GetExtension(Traits::default_bool_extension)","false",
                 "true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_78,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                 ,0xd03,(char *)CONCAT71(local_70._1_7_,local_70[0]));
      testing::internal::AssertHelper::operator=(&local_78,(Message *)&local_90);
      testing::internal::AssertHelper::~AssertHelper(&local_78);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_70._1_7_,local_70[0]) != &local_60) {
        operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT71(local_70._1_7_,local_70[0]),local_60._M_allocated_capacity + 1);
      }
      if (local_90._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_90._M_head_impl + 8))();
      }
      if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_80,local_80);
      }
    }
    psVar6 = protobuf::internal::ExtensionSet::GetString
                       (&(this->_impl_)._extensions_,proto2_unittest::default_string_extension,
                        (string *)PTR_default_string_extension_default_abi_cxx11__01945380);
    testing::internal::CmpHelperEQ<char[6],std::__cxx11::string>
              ((internal *)local_70,"\"hello\"",
               "message.GetExtension(Traits::default_string_extension)",(char (*) [6])0x1217309,
               psVar6);
    if (local_70[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_88);
      if (local_68 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar8 = anon_var_dwarf_a22956 + 5;
      }
      else {
        pcVar8 = (local_68->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_90,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                 ,0xd04,pcVar8);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_90,(Message *)&local_88);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_90);
      if (local_88._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_88._M_head_impl + 8))();
      }
    }
    if (local_68 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_68,local_68);
    }
    psVar6 = protobuf::internal::ExtensionSet::GetString
                       (&(this->_impl_)._extensions_,proto2_unittest::default_bytes_extension,
                        (string *)PTR_default_bytes_extension_default_abi_cxx11__01945390);
    testing::internal::CmpHelperEQ<char[6],std::__cxx11::string>
              ((internal *)local_70,"\"world\"",
               "message.GetExtension(Traits::default_bytes_extension)",(char (*) [6])0x10754c0,
               psVar6);
    if (local_70[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_88);
      if (local_68 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar8 = anon_var_dwarf_a22956 + 5;
      }
      else {
        pcVar8 = (local_68->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_90,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                 ,0xd05,pcVar8);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_90,(Message *)&local_88);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_90);
      if (local_88._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_88._M_head_impl + 8))();
      }
    }
    if (local_68 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_68,local_68);
    }
    iVar5 = protobuf::internal::ExtensionSet::GetEnum
                      (&(this->_impl_)._extensions_,proto2_unittest::default_nested_enum_extension,
                       DAT_0194539c);
    local_88._M_head_impl._0_4_ = iVar5;
    testing::internal::
    CmpHelperEQ<proto2_unittest::TestAllTypes_NestedEnum,proto2_unittest::TestAllTypes_NestedEnum>
              ((internal *)local_70,"Traits::TestAllTypes::BAR",
               "message.GetExtension(Traits::default_nested_enum_extension)",
               &proto2_unittest::TestAllTypes::BAR,(TestAllTypes_NestedEnum *)&local_88);
    if (local_70[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_88);
      if (local_68 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar8 = anon_var_dwarf_a22956 + 5;
      }
      else {
        pcVar8 = (local_68->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_90,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                 ,0xd08,pcVar8);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_90,(Message *)&local_88);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_90);
      if (local_88._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_88._M_head_impl + 8))();
      }
    }
    if (local_68 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_68,local_68);
    }
    iVar5 = protobuf::internal::ExtensionSet::GetEnum
                      (&(this->_impl_)._extensions_,proto2_unittest::default_foreign_enum_extension,
                       DAT_019453a4);
    local_88._M_head_impl._0_4_ = iVar5;
    testing::internal::CmpHelperEQ<proto2_unittest::ForeignEnum,proto2_unittest::ForeignEnum>
              ((internal *)local_70,"Traits::FOREIGN_BAR",
               "message.GetExtension(Traits::default_foreign_enum_extension)",
               &TestUtilTraits<proto2_unittest::TestAllExtensions>::FOREIGN_BAR,
               (ForeignEnum *)&local_88);
    if (local_70[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_88);
      if (local_68 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar8 = anon_var_dwarf_a22956 + 5;
      }
      else {
        pcVar8 = (local_68->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_90,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                 ,0xd0a,pcVar8);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_90,(Message *)&local_88);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_90);
      if (local_88._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_88._M_head_impl + 8))();
      }
    }
    if (local_68 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_68,local_68);
    }
    iVar5 = protobuf::internal::ExtensionSet::GetEnum
                      (&(this->_impl_)._extensions_,proto2_unittest::default_import_enum_extension,
                       DAT_019453ac);
    local_88._M_head_impl._0_4_ = iVar5;
    testing::internal::
    CmpHelperEQ<proto2_unittest_import::ImportEnum,proto2_unittest_import::ImportEnum>
              ((internal *)local_70,"Traits::IMPORT_BAR",
               "message.GetExtension(Traits::default_import_enum_extension)",
               &TestUtilTraits<proto2_unittest::TestAllExtensions>::IMPORT_BAR,
               (ImportEnum *)&local_88);
    if (local_70[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_88);
      if (local_68 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar8 = anon_var_dwarf_a22956 + 5;
      }
      else {
        pcVar8 = (local_68->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_90,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                 ,0xd0c,pcVar8);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_90,(Message *)&local_88);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_90);
      if (local_88._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_88._M_head_impl + 8))();
      }
    }
    if (local_68 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_68,local_68);
    }
    psVar6 = protobuf::internal::ExtensionSet::GetString
                       (&(this->_impl_)._extensions_,proto2_unittest::default_string_piece_extension
                        ,(string *)PTR_default_string_piece_extension_default_abi_cxx11__019453b8);
    testing::internal::CmpHelperEQ<char[4],std::__cxx11::string>
              ((internal *)local_70,"\"abc\"",
               "message.GetExtension(Traits::default_string_piece_extension)",(char (*) [4])"abc",
               psVar6);
    if (local_70[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_88);
      if (local_68 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar8 = anon_var_dwarf_a22956 + 5;
      }
      else {
        pcVar8 = (local_68->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_90,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                 ,0xd0f,pcVar8);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_90,(Message *)&local_88);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_90);
      if (local_88._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_88._M_head_impl + 8))();
      }
    }
    if (local_68 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_68,local_68);
    }
    psVar6 = protobuf::internal::ExtensionSet::GetString
                       (&(this->_impl_)._extensions_,proto2_unittest::default_cord_extension,
                        (string *)PTR_default_cord_extension_default_abi_cxx11__019453c8);
    testing::internal::CmpHelperEQ<char[4],std::__cxx11::string>
              ((internal *)local_70,"\"123\"","message.GetExtension(Traits::default_cord_extension)"
               ,(char (*) [4])0x1175e14,psVar6);
    if (local_70[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_88);
      if (local_68 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar8 = anon_var_dwarf_a22956 + 5;
      }
      else {
        pcVar8 = (local_68->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_90,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                 ,0xd10,pcVar8);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_90,(Message *)&local_88);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_90);
      if (local_88._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_88._M_head_impl + 8))();
      }
    }
    if (local_68 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_68,local_68);
    }
    bVar1 = protobuf::internal::ExtensionSet::Has
                      (&(this->_impl_)._extensions_,proto2_unittest::oneof_uint32_extension);
    local_80 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_88._M_head_impl._0_1_ = (internal)!bVar1;
    if (bVar1) {
      testing::Message::Message((Message *)&local_90);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_70,(internal *)&local_88,
                 (AssertionResult *)"message.HasExtension(Traits::oneof_uint32_extension)","true",
                 "false",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_78,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                 ,0xd12,(char *)CONCAT71(local_70._1_7_,local_70[0]));
      testing::internal::AssertHelper::operator=(&local_78,(Message *)&local_90);
      testing::internal::AssertHelper::~AssertHelper(&local_78);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_70._1_7_,local_70[0]) != &local_60) {
        operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT71(local_70._1_7_,local_70[0]),local_60._M_allocated_capacity + 1);
      }
      if (local_90._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_90._M_head_impl + 8))();
      }
      if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_80,local_80);
      }
    }
    pMVar7 = protobuf::internal::ExtensionSet::GetMessage
                       (&(this->_impl_)._extensions_,proto2_unittest::oneof_nested_message_extension
                        ,(MessageLite *)PTR__TestAllTypes_NestedMessage_default_instance__019453e0);
    uVar4 = *(uint *)&pMVar7[1]._vptr_MessageLite & 1;
    local_88._M_head_impl._0_1_ = (internal)((byte)uVar4 ^ 1);
    local_80 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (uVar4 != 0) {
      testing::Message::Message((Message *)&local_90);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_70,(internal *)&local_88,
                 (AssertionResult *)
                 "message.GetExtension(Traits::oneof_nested_message_extension).has_bb()","true",
                 "false",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_78,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                 ,0xd14,(char *)CONCAT71(local_70._1_7_,local_70[0]));
      testing::internal::AssertHelper::operator=(&local_78,(Message *)&local_90);
      testing::internal::AssertHelper::~AssertHelper(&local_78);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_70._1_7_,local_70[0]) != &local_60) {
        operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT71(local_70._1_7_,local_70[0]),local_60._M_allocated_capacity + 1);
      }
      if (local_90._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_90._M_head_impl + 8))();
      }
      if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_80,local_80);
      }
    }
    bVar1 = protobuf::internal::ExtensionSet::Has
                      (&(this->_impl_)._extensions_,proto2_unittest::oneof_string_extension);
    local_88._M_head_impl._0_1_ = (internal)!bVar1;
    local_80 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (bVar1) {
      testing::Message::Message((Message *)&local_90);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_70,(internal *)&local_88,
                 (AssertionResult *)"message.HasExtension(Traits::oneof_string_extension)","true",
                 "false",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_78,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                 ,0xd15,(char *)CONCAT71(local_70._1_7_,local_70[0]));
      testing::internal::AssertHelper::operator=(&local_78,(Message *)&local_90);
      testing::internal::AssertHelper::~AssertHelper(&local_78);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_70._1_7_,local_70[0]) != &local_60) {
        operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT71(local_70._1_7_,local_70[0]),local_60._M_allocated_capacity + 1);
      }
      if (local_90._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_90._M_head_impl + 8))();
      }
      if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_80,local_80);
      }
    }
    bVar1 = protobuf::internal::ExtensionSet::Has
                      (&(this->_impl_)._extensions_,proto2_unittest::oneof_bytes_extension);
    local_88._M_head_impl._0_1_ = (internal)!bVar1;
    local_80 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (!bVar1) goto LAB_006b455b;
    testing::Message::Message((Message *)&local_90);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_70,(internal *)&local_88,
               (AssertionResult *)"message.HasExtension(Traits::oneof_bytes_extension)","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
               ,0xd16,(char *)CONCAT71(local_70._1_7_,local_70[0]));
    testing::internal::AssertHelper::operator=(&local_78,(Message *)&local_90);
  }
  else {
    testing::Message::Message((Message *)&local_90);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_70,(internal *)&local_88,(AssertionResult *)0x10ec301,"false","true",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_78,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
               ,0xc57,(char *)CONCAT71(local_70._1_7_,local_70[0]));
    testing::internal::AssertHelper::operator=(&local_78,(Message *)&local_90);
  }
  testing::internal::AssertHelper::~AssertHelper(&local_78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_70._1_7_,local_70[0]) != &local_60) {
    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT71(local_70._1_7_,local_70[0]),local_60._M_allocated_capacity + 1);
  }
  if (local_90._M_head_impl !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    (**(code **)(*(long *)local_90._M_head_impl + 8))();
  }
  if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_80,local_80);
  }
LAB_006b455b:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,
                    CONCAT71(local_50.field_2._M_allocated_capacity._1_7_,
                             local_50.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void ExpectExtensionsClear(const TestAllExtensions& message) {
  using Traits = TestUtilTraits<TestAllExtensions>;
  std::string serialized;
  ASSERT_TRUE(message.SerializeToString(&serialized));
  EXPECT_EQ("", serialized);
  EXPECT_EQ(0, message.ByteSizeLong());

  // has_blah() should initially be false for all optional fields.
  EXPECT_FALSE(message.HasExtension(Traits::optional_int32_extension));
  EXPECT_FALSE(message.HasExtension(Traits::optional_int64_extension));
  EXPECT_FALSE(message.HasExtension(Traits::optional_uint32_extension));
  EXPECT_FALSE(message.HasExtension(Traits::optional_uint64_extension));
  EXPECT_FALSE(message.HasExtension(Traits::optional_sint32_extension));
  EXPECT_FALSE(message.HasExtension(Traits::optional_sint64_extension));
  EXPECT_FALSE(message.HasExtension(Traits::optional_fixed32_extension));
  EXPECT_FALSE(message.HasExtension(Traits::optional_fixed64_extension));
  EXPECT_FALSE(message.HasExtension(Traits::optional_sfixed32_extension));
  EXPECT_FALSE(message.HasExtension(Traits::optional_sfixed64_extension));
  EXPECT_FALSE(message.HasExtension(Traits::optional_float_extension));
  EXPECT_FALSE(message.HasExtension(Traits::optional_double_extension));
  EXPECT_FALSE(message.HasExtension(Traits::optional_bool_extension));
  EXPECT_FALSE(message.HasExtension(Traits::optional_string_extension));
  EXPECT_FALSE(message.HasExtension(Traits::optional_bytes_extension));

  EXPECT_FALSE(message.HasExtension(Traits::optionalgroup_extension));
  EXPECT_FALSE(message.HasExtension(Traits::optional_nested_message_extension));
  EXPECT_FALSE(
      message.HasExtension(Traits::optional_foreign_message_extension));
  EXPECT_FALSE(message.HasExtension(Traits::optional_import_message_extension));
  EXPECT_FALSE(
      message.HasExtension(Traits::optional_public_import_message_extension));
  EXPECT_FALSE(message.HasExtension(Traits::optional_lazy_message_extension));
  EXPECT_FALSE(
      message.HasExtension(Traits::optional_unverified_lazy_message_extension));

  EXPECT_FALSE(message.HasExtension(Traits::optional_nested_enum_extension));
  EXPECT_FALSE(message.HasExtension(Traits::optional_foreign_enum_extension));
  EXPECT_FALSE(message.HasExtension(Traits::optional_import_enum_extension));

  EXPECT_FALSE(message.HasExtension(Traits::optional_string_piece_extension));
  EXPECT_FALSE(message.HasExtension(Traits::optional_cord_extension));
  EXPECT_FALSE(message.HasExtension(Traits::optional_bytes_cord_extension));

  // Optional fields without defaults are set to zero or something like it.
  EXPECT_EQ(0, message.GetExtension(Traits::optional_int32_extension));
  EXPECT_EQ(0, message.GetExtension(Traits::optional_int64_extension));
  EXPECT_EQ(0, message.GetExtension(Traits::optional_uint32_extension));
  EXPECT_EQ(0, message.GetExtension(Traits::optional_uint64_extension));
  EXPECT_EQ(0, message.GetExtension(Traits::optional_sint32_extension));
  EXPECT_EQ(0, message.GetExtension(Traits::optional_sint64_extension));
  EXPECT_EQ(0, message.GetExtension(Traits::optional_fixed32_extension));
  EXPECT_EQ(0, message.GetExtension(Traits::optional_fixed64_extension));
  EXPECT_EQ(0, message.GetExtension(Traits::optional_sfixed32_extension));
  EXPECT_EQ(0, message.GetExtension(Traits::optional_sfixed64_extension));
  EXPECT_EQ(0, message.GetExtension(Traits::optional_float_extension));
  EXPECT_EQ(0, message.GetExtension(Traits::optional_double_extension));
  EXPECT_FALSE(message.GetExtension(Traits::optional_bool_extension));
  EXPECT_EQ("", message.GetExtension(Traits::optional_string_extension));
  EXPECT_EQ("", message.GetExtension(Traits::optional_bytes_extension));

  // Embedded messages should also be clear.
  EXPECT_FALSE(message.GetExtension(Traits::optionalgroup_extension).has_a());
  EXPECT_FALSE(
      message.GetExtension(Traits::optional_nested_message_extension).has_bb());
  EXPECT_FALSE(
      message.GetExtension(Traits::optional_foreign_message_extension).has_c());
  EXPECT_FALSE(
      message.GetExtension(Traits::optional_import_message_extension).has_d());
  EXPECT_FALSE(
      message.GetExtension(Traits::optional_public_import_message_extension)
          .has_e());
  EXPECT_FALSE(
      message.GetExtension(Traits::optional_lazy_message_extension).has_bb());
  EXPECT_FALSE(
      message.GetExtension(Traits::optional_unverified_lazy_message_extension)
          .has_bb());

  EXPECT_EQ(0, message.GetExtension(Traits::optionalgroup_extension).a());
  EXPECT_EQ(
      0, message.GetExtension(Traits::optional_nested_message_extension).bb());
  EXPECT_EQ(
      0, message.GetExtension(Traits::optional_foreign_message_extension).c());
  EXPECT_EQ(
      0, message.GetExtension(Traits::optional_import_message_extension).d());
  EXPECT_EQ(
      0, message.GetExtension(Traits::optional_public_import_message_extension)
             .e());
  EXPECT_EQ(0,
            message.GetExtension(Traits::optional_lazy_message_extension).bb());
  EXPECT_EQ(
      0,
      message.GetExtension(Traits::optional_unverified_lazy_message_extension)
          .bb());

  // Enums without defaults are set to the first value in the enum.
  EXPECT_EQ(Traits::TestAllTypes::FOO,
            message.GetExtension(Traits::optional_nested_enum_extension));
  EXPECT_EQ(Traits::FOREIGN_FOO,
            message.GetExtension(Traits::optional_foreign_enum_extension));
  EXPECT_EQ(Traits::IMPORT_FOO,
            message.GetExtension(Traits::optional_import_enum_extension));

  EXPECT_EQ("", message.GetExtension(Traits::optional_string_piece_extension));
  EXPECT_EQ("", message.GetExtension(Traits::optional_cord_extension));
  EXPECT_EQ("", message.GetExtension(Traits::optional_bytes_cord_extension));

  // Repeated fields are empty.
  EXPECT_EQ(0, message.ExtensionSize(Traits::repeated_int32_extension));
  EXPECT_EQ(0, message.ExtensionSize(Traits::repeated_int64_extension));
  EXPECT_EQ(0, message.ExtensionSize(Traits::repeated_uint32_extension));
  EXPECT_EQ(0, message.ExtensionSize(Traits::repeated_uint64_extension));
  EXPECT_EQ(0, message.ExtensionSize(Traits::repeated_sint32_extension));
  EXPECT_EQ(0, message.ExtensionSize(Traits::repeated_sint64_extension));
  EXPECT_EQ(0, message.ExtensionSize(Traits::repeated_fixed32_extension));
  EXPECT_EQ(0, message.ExtensionSize(Traits::repeated_fixed64_extension));
  EXPECT_EQ(0, message.ExtensionSize(Traits::repeated_sfixed32_extension));
  EXPECT_EQ(0, message.ExtensionSize(Traits::repeated_sfixed64_extension));
  EXPECT_EQ(0, message.ExtensionSize(Traits::repeated_float_extension));
  EXPECT_EQ(0, message.ExtensionSize(Traits::repeated_double_extension));
  EXPECT_EQ(0, message.ExtensionSize(Traits::repeated_bool_extension));
  EXPECT_EQ(0, message.ExtensionSize(Traits::repeated_string_extension));
  EXPECT_EQ(0, message.ExtensionSize(Traits::repeated_bytes_extension));

  EXPECT_EQ(0, message.ExtensionSize(Traits::repeatedgroup_extension));
  EXPECT_EQ(0,
            message.ExtensionSize(Traits::repeated_nested_message_extension));
  EXPECT_EQ(0,
            message.ExtensionSize(Traits::repeated_foreign_message_extension));
  EXPECT_EQ(0,
            message.ExtensionSize(Traits::repeated_import_message_extension));
  EXPECT_EQ(0, message.ExtensionSize(Traits::repeated_lazy_message_extension));
  EXPECT_EQ(0, message.ExtensionSize(Traits::repeated_nested_enum_extension));
  EXPECT_EQ(0, message.ExtensionSize(Traits::repeated_foreign_enum_extension));
  EXPECT_EQ(0, message.ExtensionSize(Traits::repeated_import_enum_extension));

  EXPECT_EQ(0, message.ExtensionSize(Traits::repeated_string_piece_extension));
  EXPECT_EQ(0, message.ExtensionSize(Traits::repeated_cord_extension));

  // has_blah() should also be false for all default fields.
  EXPECT_FALSE(message.HasExtension(Traits::default_int32_extension));
  EXPECT_FALSE(message.HasExtension(Traits::default_int64_extension));
  EXPECT_FALSE(message.HasExtension(Traits::default_uint32_extension));
  EXPECT_FALSE(message.HasExtension(Traits::default_uint64_extension));
  EXPECT_FALSE(message.HasExtension(Traits::default_sint32_extension));
  EXPECT_FALSE(message.HasExtension(Traits::default_sint64_extension));
  EXPECT_FALSE(message.HasExtension(Traits::default_fixed32_extension));
  EXPECT_FALSE(message.HasExtension(Traits::default_fixed64_extension));
  EXPECT_FALSE(message.HasExtension(Traits::default_sfixed32_extension));
  EXPECT_FALSE(message.HasExtension(Traits::default_sfixed64_extension));
  EXPECT_FALSE(message.HasExtension(Traits::default_float_extension));
  EXPECT_FALSE(message.HasExtension(Traits::default_double_extension));
  EXPECT_FALSE(message.HasExtension(Traits::default_bool_extension));
  EXPECT_FALSE(message.HasExtension(Traits::default_string_extension));
  EXPECT_FALSE(message.HasExtension(Traits::default_bytes_extension));

  EXPECT_FALSE(message.HasExtension(Traits::default_nested_enum_extension));
  EXPECT_FALSE(message.HasExtension(Traits::default_foreign_enum_extension));
  EXPECT_FALSE(message.HasExtension(Traits::default_import_enum_extension));

  EXPECT_FALSE(message.HasExtension(Traits::default_string_piece_extension));
  EXPECT_FALSE(message.HasExtension(Traits::default_cord_extension));

  // Fields with defaults have their default values (duh).
  EXPECT_EQ(41, message.GetExtension(Traits::default_int32_extension));
  EXPECT_EQ(42, message.GetExtension(Traits::default_int64_extension));
  EXPECT_EQ(43, message.GetExtension(Traits::default_uint32_extension));
  EXPECT_EQ(44, message.GetExtension(Traits::default_uint64_extension));
  EXPECT_EQ(-45, message.GetExtension(Traits::default_sint32_extension));
  EXPECT_EQ(46, message.GetExtension(Traits::default_sint64_extension));
  EXPECT_EQ(47, message.GetExtension(Traits::default_fixed32_extension));
  EXPECT_EQ(48, message.GetExtension(Traits::default_fixed64_extension));
  EXPECT_EQ(49, message.GetExtension(Traits::default_sfixed32_extension));
  EXPECT_EQ(-50, message.GetExtension(Traits::default_sfixed64_extension));
  EXPECT_EQ(51.5, message.GetExtension(Traits::default_float_extension));
  EXPECT_EQ(52e3, message.GetExtension(Traits::default_double_extension));
  EXPECT_TRUE(message.GetExtension(Traits::default_bool_extension));
  EXPECT_EQ("hello", message.GetExtension(Traits::default_string_extension));
  EXPECT_EQ("world", message.GetExtension(Traits::default_bytes_extension));

  EXPECT_EQ(Traits::TestAllTypes::BAR,
            message.GetExtension(Traits::default_nested_enum_extension));
  EXPECT_EQ(Traits::FOREIGN_BAR,
            message.GetExtension(Traits::default_foreign_enum_extension));
  EXPECT_EQ(Traits::IMPORT_BAR,
            message.GetExtension(Traits::default_import_enum_extension));

  EXPECT_EQ("abc",
            message.GetExtension(Traits::default_string_piece_extension));
  EXPECT_EQ("123", message.GetExtension(Traits::default_cord_extension));

  EXPECT_FALSE(message.HasExtension(Traits::oneof_uint32_extension));
  EXPECT_FALSE(
      message.GetExtension(Traits::oneof_nested_message_extension).has_bb());
  EXPECT_FALSE(message.HasExtension(Traits::oneof_string_extension));
  EXPECT_FALSE(message.HasExtension(Traits::oneof_bytes_extension));
}